

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  RTCRayQueryFlags *pRVar2;
  float *pfVar3;
  RTCRayQueryFlags *pRVar4;
  float *pfVar5;
  RTCRayQueryFlags *pRVar6;
  RTCRayQueryFlags *pRVar7;
  Primitive *pPVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar18;
  Primitive PVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined6 uVar81;
  undefined1 auVar82 [12];
  unkbyte9 Var83;
  undefined1 auVar84 [13];
  undefined1 auVar85 [12];
  undefined1 auVar86 [13];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [13];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [13];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [13];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [13];
  undefined1 auVar114 [15];
  vfloat_impl<4> vVar115;
  undefined4 uVar116;
  ulong uVar117;
  StackEntry *pSVar118;
  RTCRayN *pRVar119;
  RTCRayN *extraout_RAX;
  RTCRayN *extraout_RAX_00;
  undefined4 uVar121;
  RTCIntersectArguments *pRVar122;
  RTCIntersectArguments *pRVar123;
  RTCIntersectArguments *extraout_RDX;
  RTCIntersectArguments *extraout_RDX_00;
  RTCIntersectArguments *extraout_RDX_01;
  RTCIntersectArguments *pRVar124;
  RTCIntersectArguments *extraout_RDX_02;
  RTCIntersectArguments *extraout_RDX_03;
  RTCIntersectArguments *extraout_RDX_04;
  RTCIntersectArguments *pRVar125;
  RTCIntersectArguments *pRVar126;
  long lVar127;
  long lVar128;
  bool bVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  char cVar138;
  short sVar139;
  float fVar140;
  char cVar180;
  undefined2 uVar182;
  undefined1 auVar141 [12];
  undefined1 uVar181;
  float fVar184;
  __m128 a_1;
  char cVar185;
  undefined1 auVar142 [16];
  float fVar186;
  float fVar187;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar188;
  undefined1 auVar190 [12];
  undefined8 uVar189;
  vfloat4 a;
  undefined1 auVar192 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar191 [12];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  int iVar233;
  int iVar234;
  float fVar235;
  float fVar236;
  int iVar263;
  float fVar266;
  undefined1 auVar239 [16];
  undefined1 auVar243 [16];
  undefined1 auVar247 [16];
  float fVar264;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar265;
  float fVar267;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar268;
  int iVar269;
  int iVar270;
  float fVar297;
  vfloat_impl<4> t;
  undefined1 auVar275 [16];
  undefined1 auVar279 [16];
  undefined1 auVar283 [16];
  float fVar298;
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar299;
  undefined1 auVar301 [12];
  float fVar322;
  float fVar324;
  float fVar327;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar300;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar321 [16];
  float fVar338;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar335;
  undefined1 auVar336 [16];
  float fVar347;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar348;
  float fVar354;
  float fVar355;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar356;
  float fVar363;
  float fVar364;
  float fVar366;
  float fVar368;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar365;
  float fVar367;
  float fVar369;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar361;
  undefined1 auVar362 [16];
  float fVar370;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar386;
  float fVar390;
  undefined1 auVar382 [16];
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  float fVar397;
  float fVar405;
  float fVar407;
  undefined1 auVar399 [16];
  float fVar398;
  undefined1 auVar400 [16];
  float fVar406;
  float fVar408;
  float fVar409;
  float fVar410;
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar417;
  float fVar418;
  float fVar421;
  float fVar422;
  float fVar425;
  undefined1 auVar414 [16];
  float fVar419;
  float fVar420;
  float fVar423;
  float fVar424;
  float fVar426;
  float fVar427;
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  float fVar428;
  float fVar429;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar430 [16];
  undefined1 auVar432 [16];
  float fVar439;
  float fVar440;
  float fVar441;
  uint uVar442;
  uint uVar443;
  float fVar444;
  float fVar445;
  float fVar446;
  float fVar450;
  float fVar451;
  float fVar452;
  float fVar453;
  float fVar454;
  float fVar455;
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 local_628 [8];
  float fStack_620;
  float fStack_61c;
  float local_60c;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  undefined1 local_578 [6];
  undefined2 uStack_572;
  float fStack_570;
  float fStack_56c;
  RTCFilterFunctionNArguments args;
  undefined8 local_528;
  int local_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  vfloatx vu0;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  Primitive *local_318;
  ulong local_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  ulong uVar120;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar143 [16];
  int iVar183;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar200 [16];
  undefined1 auVar204 [16];
  undefined1 auVar201 [16];
  undefined1 auVar205 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar237 [12];
  undefined1 auVar238 [12];
  undefined1 auVar244 [16];
  undefined1 auVar248 [16];
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar271 [12];
  undefined1 auVar272 [12];
  undefined1 auVar273 [12];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar276 [16];
  undefined1 auVar280 [16];
  undefined1 auVar284 [16];
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar285 [16];
  undefined1 auVar305 [16];
  undefined1 auVar316 [16];
  undefined1 auVar320 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar337 [16];
  undefined1 auVar431 [16];
  undefined1 auVar447 [16];
  
  PVar19 = prim[1];
  uVar117 = (ulong)(byte)PVar19;
  lVar127 = uVar117 * 0x25;
  uVar116 = *(undefined4 *)(prim + uVar117 * 4 + 6);
  uVar20 = *(undefined4 *)(prim + uVar117 * 5 + 6);
  uVar21 = *(undefined4 *)(prim + uVar117 * 6 + 6);
  uVar121 = *(undefined4 *)(prim + uVar117 * 0xf + 6);
  uVar22 = *(undefined4 *)(prim + (ulong)(byte)PVar19 * 0x10 + 6);
  uVar23 = *(undefined4 *)(prim + uVar117 * 0x11 + 6);
  uVar24 = *(undefined4 *)(prim + uVar117 * 0x1a + 6);
  uVar25 = *(undefined4 *)(prim + uVar117 * 0x1b + 6);
  pPVar8 = prim + lVar127 + 6;
  fVar421 = *(float *)(pPVar8 + 0xc);
  fVar439 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar421;
  fVar440 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar421;
  fVar441 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar421;
  fVar411 = fVar421 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar417 = fVar421 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar421 = fVar421 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar181 = (undefined1)((uint)uVar20 >> 0x18);
  uVar182 = CONCAT11(uVar181,uVar181);
  uVar181 = (undefined1)((uint)uVar20 >> 0x10);
  uVar189 = CONCAT35(CONCAT21(uVar182,uVar181),CONCAT14(uVar181,uVar20));
  cVar180 = (char)((uint)uVar20 >> 8);
  uVar81 = CONCAT51(CONCAT41((int)((ulong)uVar189 >> 0x20),cVar180),cVar180);
  cVar138 = (char)uVar20;
  uVar120 = CONCAT62(uVar81,CONCAT11(cVar138,cVar138));
  auVar241._8_4_ = 0;
  auVar241._0_8_ = uVar120;
  auVar241._12_2_ = uVar182;
  auVar241._14_2_ = uVar182;
  uVar182 = (undefined2)((ulong)uVar189 >> 0x20);
  auVar240._12_4_ = auVar241._12_4_;
  auVar240._8_2_ = 0;
  auVar240._0_8_ = uVar120;
  auVar240._10_2_ = uVar182;
  auVar239._10_6_ = auVar240._10_6_;
  auVar239._8_2_ = uVar182;
  auVar239._0_8_ = uVar120;
  uVar182 = (undefined2)uVar81;
  auVar82._4_8_ = auVar239._8_8_;
  auVar82._2_2_ = uVar182;
  auVar82._0_2_ = uVar182;
  iVar233 = (int)CONCAT11(cVar138,cVar138) >> 8;
  iVar263 = auVar82._0_4_ >> 0x18;
  auVar237._0_8_ = CONCAT44(iVar263,iVar233);
  auVar237._8_4_ = auVar239._8_4_ >> 0x18;
  auVar242._12_4_ = auVar240._12_4_ >> 0x18;
  auVar242._0_12_ = auVar237;
  fVar347 = (float)iVar263;
  cVar185 = cVar180 >> 7;
  auVar33[0xd] = 0;
  auVar33._0_13_ = auVar242._0_13_;
  auVar33[0xe] = cVar185;
  auVar38[0xc] = cVar185;
  auVar38._0_12_ = auVar237;
  auVar38._13_2_ = auVar33._13_2_;
  auVar43[0xb] = 0;
  auVar43._0_11_ = auVar237._0_11_;
  auVar43._12_3_ = auVar38._12_3_;
  auVar48[10] = cVar185;
  auVar48._0_10_ = auVar237._0_10_;
  auVar48._11_4_ = auVar43._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = auVar237._0_9_;
  auVar53._10_5_ = auVar48._10_5_;
  auVar58[8] = cVar180;
  auVar58._0_8_ = auVar237._0_8_;
  auVar58._9_6_ = auVar53._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar138 >> 7);
  auVar63._6_9_ = Var83;
  auVar63[5] = (char)((uint)uVar21 >> 0x10);
  auVar63[4] = (undefined1)((short)cVar138 >> 7);
  auVar63._0_4_ = iVar233;
  cVar185 = (char)((uint)uVar21 >> 8);
  auVar84._2_11_ = auVar63._4_11_;
  auVar84[1] = cVar185;
  auVar84[0] = (undefined1)((short)cVar138 >> 7);
  cVar180 = (char)uVar21;
  auVar68._2_13_ = auVar84;
  auVar68._0_2_ = CONCAT11(cVar180,cVar138);
  uVar182 = (undefined2)Var83;
  auVar245._0_12_ = auVar68._0_12_;
  auVar245._12_2_ = uVar182;
  auVar245._14_2_ = uVar182;
  auVar244._12_4_ = auVar245._12_4_;
  auVar244._0_10_ = auVar68._0_10_;
  auVar244._10_2_ = auVar63._4_2_;
  auVar243._10_6_ = auVar244._10_6_;
  auVar243._0_8_ = auVar68._0_8_;
  auVar243._8_2_ = auVar63._4_2_;
  auVar85._4_8_ = auVar243._8_8_;
  auVar85._2_2_ = auVar84._0_2_;
  auVar85._0_2_ = auVar84._0_2_;
  iVar234 = (int)CONCAT11(cVar180,cVar138) >> 8;
  iVar263 = auVar85._0_4_ >> 0x18;
  auVar238._0_8_ = CONCAT44(iVar263,iVar234);
  auVar238._8_4_ = auVar243._8_4_ >> 0x18;
  auVar246._12_4_ = auVar244._12_4_ >> 0x18;
  auVar246._0_12_ = auVar238;
  fVar363 = (float)iVar263;
  cVar138 = cVar185 >> 7;
  auVar34[0xd] = 0;
  auVar34._0_13_ = auVar246._0_13_;
  auVar34[0xe] = cVar138;
  auVar39[0xc] = cVar138;
  auVar39._0_12_ = auVar238;
  auVar39._13_2_ = auVar34._13_2_;
  auVar44[0xb] = 0;
  auVar44._0_11_ = auVar238._0_11_;
  auVar44._12_3_ = auVar39._12_3_;
  auVar49[10] = cVar138;
  auVar49._0_10_ = auVar238._0_10_;
  auVar49._11_4_ = auVar44._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar238._0_9_;
  auVar54._10_5_ = auVar49._10_5_;
  auVar59[8] = cVar185;
  auVar59._0_8_ = auVar238._0_8_;
  auVar59._9_6_ = auVar54._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar180 >> 7);
  auVar64._6_9_ = Var83;
  auVar64[5] = (char)((uint)uVar22 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar180 >> 7);
  auVar64._0_4_ = iVar234;
  auVar86._2_11_ = auVar64._4_11_;
  auVar86[1] = (char)((uint)uVar22 >> 8);
  auVar86[0] = (undefined1)((short)cVar180 >> 7);
  sVar139 = CONCAT11((char)uVar22,cVar180);
  auVar69._2_13_ = auVar86;
  auVar69._0_2_ = sVar139;
  uVar182 = (undefined2)Var83;
  auVar249._0_12_ = auVar69._0_12_;
  auVar249._12_2_ = uVar182;
  auVar249._14_2_ = uVar182;
  auVar248._12_4_ = auVar249._12_4_;
  auVar248._0_10_ = auVar69._0_10_;
  auVar248._10_2_ = auVar64._4_2_;
  auVar247._10_6_ = auVar248._10_6_;
  auVar247._0_8_ = auVar69._0_8_;
  auVar247._8_2_ = auVar64._4_2_;
  auVar87._4_8_ = auVar247._8_8_;
  auVar87._2_2_ = auVar86._0_2_;
  auVar87._0_2_ = auVar86._0_2_;
  fVar348 = (float)((int)sVar139 >> 8);
  fVar354 = (float)(auVar87._0_4_ >> 0x18);
  fVar355 = (float)(auVar247._8_4_ >> 0x18);
  uVar181 = (undefined1)((uint)uVar23 >> 0x18);
  uVar182 = CONCAT11(uVar181,uVar181);
  uVar181 = (undefined1)((uint)uVar23 >> 0x10);
  uVar189 = CONCAT35(CONCAT21(uVar182,uVar181),CONCAT14(uVar181,uVar23));
  uVar181 = (undefined1)((uint)uVar23 >> 8);
  uVar81 = CONCAT51(CONCAT41((int)((ulong)uVar189 >> 0x20),uVar181),uVar181);
  sVar139 = CONCAT11((char)uVar23,(char)uVar23);
  uVar120 = CONCAT62(uVar81,sVar139);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar120;
  auVar194._12_2_ = uVar182;
  auVar194._14_2_ = uVar182;
  uVar182 = (undefined2)((ulong)uVar189 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar120;
  auVar193._10_2_ = uVar182;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar182;
  auVar192._0_8_ = uVar120;
  uVar182 = (undefined2)uVar81;
  auVar88._4_8_ = auVar192._8_8_;
  auVar88._2_2_ = uVar182;
  auVar88._0_2_ = uVar182;
  fVar370 = (float)((int)sVar139 >> 8);
  fVar374 = (float)(auVar88._0_4_ >> 0x18);
  fVar375 = (float)(auVar192._8_4_ >> 0x18);
  uVar20 = *(undefined4 *)(prim + uVar117 * 0x1c + 6);
  fVar268 = fVar421 * fVar370;
  fVar297 = fVar421 * fVar374;
  auVar271._0_8_ = CONCAT44(fVar297,fVar268);
  auVar271._8_4_ = fVar421 * fVar375;
  auVar274._12_4_ = fVar421 * (float)(auVar193._12_4_ >> 0x18);
  auVar274._0_12_ = auVar271;
  fVar235 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar127 + 0x16)) *
            *(float *)(prim + lVar127 + 0x1a);
  _local_4c8 = ZEXT416((uint)fVar235);
  auVar35[0xd] = 0;
  auVar35._0_13_ = auVar274._0_13_;
  auVar35[0xe] = (char)((uint)fVar297 >> 0x18);
  auVar40[0xc] = (char)((uint)fVar297 >> 0x10);
  auVar40._0_12_ = auVar271;
  auVar40._13_2_ = auVar35._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = auVar271._0_11_;
  auVar45._12_3_ = auVar40._12_3_;
  auVar50[10] = (char)((uint)fVar297 >> 8);
  auVar50._0_10_ = auVar271._0_10_;
  auVar50._11_4_ = auVar45._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar271._0_9_;
  auVar55._10_5_ = auVar50._10_5_;
  auVar60[8] = SUB41(fVar297,0);
  auVar60._0_8_ = auVar271._0_8_;
  auVar60._9_6_ = auVar55._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar116 >> 0x18)),
                   (char)((uint)fVar268 >> 0x18));
  auVar65._6_9_ = Var83;
  auVar65[5] = (char)((uint)uVar116 >> 0x10);
  auVar65[4] = (char)((uint)fVar268 >> 0x10);
  auVar65._0_4_ = fVar268;
  cVar185 = (char)((uint)uVar116 >> 8);
  auVar89._2_11_ = auVar65._4_11_;
  auVar89[1] = cVar185;
  auVar89[0] = (char)((uint)fVar268 >> 8);
  cVar180 = (char)uVar116;
  sVar139 = CONCAT11(cVar180,SUB41(fVar268,0));
  auVar70._2_13_ = auVar89;
  auVar70._0_2_ = sVar139;
  uVar182 = (undefined2)Var83;
  auVar277._0_12_ = auVar70._0_12_;
  auVar277._12_2_ = uVar182;
  auVar277._14_2_ = uVar182;
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._0_10_ = auVar70._0_10_;
  auVar276._10_2_ = auVar65._4_2_;
  auVar275._10_6_ = auVar276._10_6_;
  auVar275._0_8_ = auVar70._0_8_;
  auVar275._8_2_ = auVar65._4_2_;
  auVar90._4_8_ = auVar275._8_8_;
  auVar90._2_2_ = auVar89._0_2_;
  auVar90._0_2_ = auVar89._0_2_;
  iVar269 = (int)sVar139 >> 8;
  iVar263 = auVar90._0_4_ >> 0x18;
  auVar272._0_8_ = CONCAT44(iVar263,iVar269);
  auVar272._8_4_ = auVar275._8_4_ >> 0x18;
  auVar278._12_4_ = auVar276._12_4_ >> 0x18;
  auVar278._0_12_ = auVar272;
  fVar338 = (float)iVar263;
  local_628[0] = (char)uVar121;
  local_628[1] = (char)((uint)uVar121 >> 8);
  local_628[2] = (undefined1)((uint)uVar121 >> 0x10);
  local_628[3] = (undefined1)((uint)uVar121 >> 0x18);
  cVar138 = cVar185 >> 7;
  auVar106[0xd] = 0;
  auVar106._0_13_ = auVar278._0_13_;
  auVar106[0xe] = cVar138;
  auVar107[0xc] = cVar138;
  auVar107._0_12_ = auVar272;
  auVar107._13_2_ = auVar106._13_2_;
  auVar108[0xb] = 0;
  auVar108._0_11_ = auVar272._0_11_;
  auVar108._12_3_ = auVar107._12_3_;
  auVar109[10] = cVar138;
  auVar109._0_10_ = auVar272._0_10_;
  auVar109._11_4_ = auVar108._11_4_;
  auVar110[9] = 0;
  auVar110._0_9_ = auVar272._0_9_;
  auVar110._10_5_ = auVar109._10_5_;
  auVar111[8] = cVar185;
  auVar111._0_8_ = auVar272._0_8_;
  auVar111._9_6_ = auVar110._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar111._8_7_,local_628[3]),(short)cVar180 >> 7);
  auVar112._6_9_ = Var83;
  auVar112[5] = local_628[2];
  auVar112[4] = (undefined1)((short)cVar180 >> 7);
  auVar112._0_4_ = iVar269;
  auVar113._2_11_ = auVar112._4_11_;
  auVar113[1] = local_628[1];
  auVar113[0] = (undefined1)((short)cVar180 >> 7);
  auVar114._2_13_ = auVar113;
  auVar114._0_2_ = CONCAT11(local_628[0],cVar180);
  uVar182 = (undefined2)Var83;
  auVar281._0_12_ = auVar114._0_12_;
  auVar281._12_2_ = uVar182;
  auVar281._14_2_ = uVar182;
  auVar280._12_4_ = auVar281._12_4_;
  auVar280._0_10_ = auVar114._0_10_;
  auVar280._10_2_ = auVar112._4_2_;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._0_8_ = auVar114._0_8_;
  auVar279._8_2_ = auVar112._4_2_;
  auVar91._4_8_ = auVar279._8_8_;
  auVar91._2_2_ = auVar113._0_2_;
  auVar91._0_2_ = auVar113._0_2_;
  iVar270 = (int)CONCAT11(local_628[0],cVar180) >> 8;
  iVar263 = auVar91._0_4_ >> 0x18;
  auVar273._0_8_ = CONCAT44(iVar263,iVar270);
  auVar273._8_4_ = auVar279._8_4_ >> 0x18;
  auVar282._12_4_ = auVar280._12_4_ >> 0x18;
  auVar282._0_12_ = auVar273;
  fVar264 = (float)iVar263;
  cVar138 = local_628[1] >> 7;
  auVar36[0xd] = 0;
  auVar36._0_13_ = auVar282._0_13_;
  auVar36[0xe] = cVar138;
  auVar41[0xc] = cVar138;
  auVar41._0_12_ = auVar273;
  auVar41._13_2_ = auVar36._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar273._0_11_;
  auVar46._12_3_ = auVar41._12_3_;
  auVar51[10] = cVar138;
  auVar51._0_10_ = auVar273._0_10_;
  auVar51._11_4_ = auVar46._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar273._0_9_;
  auVar56._10_5_ = auVar51._10_5_;
  auVar61[8] = local_628[1];
  auVar61._0_8_ = auVar273._0_8_;
  auVar61._9_6_ = auVar56._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar24 >> 0x18)),(short)local_628[0] >> 7);
  auVar66._6_9_ = Var83;
  auVar66[5] = (char)((uint)uVar24 >> 0x10);
  auVar66[4] = (undefined1)((short)local_628[0] >> 7);
  auVar66._0_4_ = iVar270;
  auVar92._2_11_ = auVar66._4_11_;
  auVar92[1] = (char)((uint)uVar24 >> 8);
  auVar92[0] = (undefined1)((short)local_628[0] >> 7);
  sVar139 = CONCAT11((char)uVar24,local_628[0]);
  auVar71._2_13_ = auVar92;
  auVar71._0_2_ = sVar139;
  uVar182 = (undefined2)Var83;
  auVar285._0_12_ = auVar71._0_12_;
  auVar285._12_2_ = uVar182;
  auVar285._14_2_ = uVar182;
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._0_10_ = auVar71._0_10_;
  auVar284._10_2_ = auVar66._4_2_;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._0_8_ = auVar71._0_8_;
  auVar283._8_2_ = auVar66._4_2_;
  auVar93._4_8_ = auVar283._8_8_;
  auVar93._2_2_ = auVar92._0_2_;
  auVar93._0_2_ = auVar92._0_2_;
  fVar378 = (float)((int)sVar139 >> 8);
  fVar386 = (float)(auVar93._0_4_ >> 0x18);
  fVar390 = (float)(auVar283._8_4_ >> 0x18);
  uVar181 = (undefined1)((uint)uVar25 >> 0x18);
  uVar182 = CONCAT11(uVar181,uVar181);
  uVar181 = (undefined1)((uint)uVar25 >> 0x10);
  uVar189 = CONCAT35(CONCAT21(uVar182,uVar181),CONCAT14(uVar181,uVar25));
  cVar180 = (char)((uint)uVar25 >> 8);
  uVar81 = CONCAT51(CONCAT41((int)((ulong)uVar189 >> 0x20),cVar180),cVar180);
  cVar138 = (char)uVar25;
  uVar120 = CONCAT62(uVar81,CONCAT11(cVar138,cVar138));
  auVar339._8_4_ = 0;
  auVar339._0_8_ = uVar120;
  auVar339._12_2_ = uVar182;
  auVar339._14_2_ = uVar182;
  uVar182 = (undefined2)((ulong)uVar189 >> 0x20);
  auVar342._12_4_ = auVar339._12_4_;
  auVar342._8_2_ = 0;
  auVar342._0_8_ = uVar120;
  auVar342._10_2_ = uVar182;
  auVar251._10_6_ = auVar342._10_6_;
  auVar251._8_2_ = uVar182;
  auVar251._0_8_ = uVar120;
  uVar182 = (undefined2)uVar81;
  auVar94._4_8_ = auVar251._8_8_;
  auVar94._2_2_ = uVar182;
  auVar94._0_2_ = uVar182;
  iVar263 = (int)CONCAT11(cVar138,cVar138) >> 8;
  iVar183 = auVar94._0_4_ >> 0x18;
  auVar141._0_8_ = CONCAT44(iVar183,iVar263);
  auVar141._8_4_ = auVar251._8_4_ >> 0x18;
  auVar358._12_4_ = auVar342._12_4_ >> 0x18;
  auVar358._0_12_ = auVar141;
  fVar298 = (float)iVar183;
  cVar185 = cVar180 >> 7;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar358._0_13_;
  auVar37[0xe] = cVar185;
  auVar42[0xc] = cVar185;
  auVar42._0_12_ = auVar141;
  auVar42._13_2_ = auVar37._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar141._0_11_;
  auVar47._12_3_ = auVar42._12_3_;
  auVar52[10] = cVar185;
  auVar52._0_10_ = auVar141._0_10_;
  auVar52._11_4_ = auVar47._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar141._0_9_;
  auVar57._10_5_ = auVar52._10_5_;
  auVar62[8] = cVar180;
  auVar62._0_8_ = auVar141._0_8_;
  auVar62._9_6_ = auVar57._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar138 >> 7);
  auVar67._6_9_ = Var83;
  auVar67[5] = (char)((uint)uVar20 >> 0x10);
  auVar67[4] = (undefined1)((short)cVar138 >> 7);
  auVar67._0_4_ = iVar263;
  auVar95._2_11_ = auVar67._4_11_;
  auVar95[1] = (char)((uint)uVar20 >> 8);
  auVar95[0] = (undefined1)((short)cVar138 >> 7);
  sVar139 = CONCAT11((char)uVar20,cVar138);
  auVar72._2_13_ = auVar95;
  auVar72._0_2_ = sVar139;
  uVar182 = (undefined2)Var83;
  auVar143._0_12_ = auVar72._0_12_;
  auVar143._12_2_ = uVar182;
  auVar143._14_2_ = uVar182;
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._0_10_ = auVar72._0_10_;
  auVar142._10_2_ = auVar67._4_2_;
  auVar448._10_6_ = auVar142._10_6_;
  auVar448._0_8_ = auVar72._0_8_;
  auVar448._8_2_ = auVar67._4_2_;
  auVar96._4_8_ = auVar448._8_8_;
  auVar96._2_2_ = auVar95._0_2_;
  auVar96._0_2_ = auVar95._0_2_;
  fVar188 = (float)((int)sVar139 >> 8);
  fVar231 = (float)(auVar96._0_4_ >> 0x18);
  fVar232 = (float)(auVar448._8_4_ >> 0x18);
  fVar140 = fVar411 * (float)iVar269 + fVar417 * (float)iVar233 + fVar421 * (float)iVar234;
  fVar184 = fVar411 * fVar338 + fVar417 * fVar347 + fVar421 * fVar363;
  fVar186 = fVar411 * (float)auVar272._8_4_ +
            fVar417 * (float)auVar237._8_4_ + fVar421 * (float)auVar238._8_4_;
  fVar187 = fVar411 * (float)auVar278._12_4_ +
            fVar417 * (float)auVar242._12_4_ + fVar421 * (float)auVar246._12_4_;
  fVar268 = fVar411 * (float)iVar270 + fVar417 * fVar348 + fVar268;
  fVar297 = fVar411 * fVar264 + fVar417 * fVar354 + fVar297;
  fVar324 = fVar411 * (float)auVar273._8_4_ + fVar417 * fVar355 + auVar271._8_4_;
  fVar327 = fVar411 * (float)auVar282._12_4_ +
            fVar417 * (float)(auVar248._12_4_ >> 0x18) + auVar274._12_4_;
  fVar397 = fVar411 * fVar378 + fVar417 * (float)iVar263 + fVar421 * fVar188;
  fVar405 = fVar411 * fVar386 + fVar417 * fVar298 + fVar421 * fVar231;
  fVar407 = fVar411 * fVar390 + fVar417 * (float)auVar141._8_4_ + fVar421 * fVar232;
  fVar411 = fVar411 * (float)(auVar284._12_4_ >> 0x18) +
            fVar417 * (float)auVar358._12_4_ + fVar421 * (float)(auVar142._12_4_ >> 0x18);
  uVar120 = *(ulong *)(prim + uVar117 * 7 + 6);
  uVar189 = *(undefined8 *)(prim + uVar117 * 0xb + 6);
  uVar10 = *(undefined8 *)(prim + uVar117 * 9 + 6);
  uVar11 = *(ulong *)(prim + uVar117 * 0xd + 6);
  fVar417 = (float)iVar269 * fVar439 + (float)iVar233 * fVar440 + (float)iVar234 * fVar441;
  fVar418 = fVar338 * fVar439 + fVar347 * fVar440 + fVar363 * fVar441;
  fVar422 = (float)auVar272._8_4_ * fVar439 +
            (float)auVar237._8_4_ * fVar440 + (float)auVar238._8_4_ * fVar441;
  fVar425 = (float)auVar278._12_4_ * fVar439 +
            (float)auVar242._12_4_ * fVar440 + (float)auVar246._12_4_ * fVar441;
  fVar338 = (float)iVar270 * fVar439 + fVar348 * fVar440 + fVar370 * fVar441;
  fVar347 = fVar264 * fVar439 + fVar354 * fVar440 + fVar374 * fVar441;
  fVar348 = (float)auVar273._8_4_ * fVar439 + fVar355 * fVar440 + fVar375 * fVar441;
  fVar354 = (float)auVar282._12_4_ * fVar439 +
            (float)(auVar248._12_4_ >> 0x18) * fVar440 + (float)(auVar193._12_4_ >> 0x18) * fVar441;
  fVar444 = fVar439 * fVar378 + fVar440 * (float)iVar263 + fVar441 * fVar188;
  fVar450 = fVar439 * fVar386 + fVar440 * fVar298 + fVar441 * fVar231;
  fVar453 = fVar439 * fVar390 + fVar440 * (float)auVar141._8_4_ + fVar441 * fVar232;
  fVar439 = fVar439 * (float)(auVar284._12_4_ >> 0x18) +
            fVar440 * (float)auVar358._12_4_ + fVar441 * (float)(auVar142._12_4_ >> 0x18);
  fVar421 = (float)DAT_01f4bd50;
  fVar188 = DAT_01f4bd50._4_4_;
  fVar231 = DAT_01f4bd50._8_4_;
  fVar232 = DAT_01f4bd50._12_4_;
  uVar130 = -(uint)(fVar421 <= ABS(fVar140));
  uVar132 = -(uint)(fVar188 <= ABS(fVar184));
  uVar134 = -(uint)(fVar231 <= ABS(fVar186));
  uVar136 = -(uint)(fVar232 <= ABS(fVar187));
  auVar144._0_4_ = (uint)fVar140 & uVar130;
  auVar144._4_4_ = (uint)fVar184 & uVar132;
  auVar144._8_4_ = (uint)fVar186 & uVar134;
  auVar144._12_4_ = (uint)fVar187 & uVar136;
  auVar330._0_4_ = ~uVar130 & (uint)fVar421;
  auVar330._4_4_ = ~uVar132 & (uint)fVar188;
  auVar330._8_4_ = ~uVar134 & (uint)fVar231;
  auVar330._12_4_ = ~uVar136 & (uint)fVar232;
  auVar330 = auVar330 | auVar144;
  uVar130 = -(uint)(fVar421 <= ABS(fVar268));
  uVar132 = -(uint)(fVar188 <= ABS(fVar297));
  uVar134 = -(uint)(fVar231 <= ABS(fVar324));
  uVar136 = -(uint)(fVar232 <= ABS(fVar327));
  auVar302._0_4_ = (uint)fVar268 & uVar130;
  auVar302._4_4_ = (uint)fVar297 & uVar132;
  auVar302._8_4_ = (uint)fVar324 & uVar134;
  auVar302._12_4_ = (uint)fVar327 & uVar136;
  auVar145._0_4_ = ~uVar130 & (uint)fVar421;
  auVar145._4_4_ = ~uVar132 & (uint)fVar188;
  auVar145._8_4_ = ~uVar134 & (uint)fVar231;
  auVar145._12_4_ = ~uVar136 & (uint)fVar232;
  auVar145 = auVar145 | auVar302;
  uVar130 = -(uint)(fVar421 <= ABS(fVar397));
  uVar132 = -(uint)(fVar188 <= ABS(fVar405));
  uVar134 = -(uint)(fVar231 <= ABS(fVar407));
  uVar136 = -(uint)(fVar232 <= ABS(fVar411));
  auVar399._0_4_ = (uint)fVar397 & uVar130;
  auVar399._4_4_ = (uint)fVar405 & uVar132;
  auVar399._8_4_ = (uint)fVar407 & uVar134;
  auVar399._12_4_ = (uint)fVar411 & uVar136;
  auVar303._0_4_ = ~uVar130 & (uint)fVar421;
  auVar303._4_4_ = ~uVar132 & (uint)fVar188;
  auVar303._8_4_ = ~uVar134 & (uint)fVar231;
  auVar303._12_4_ = ~uVar136 & (uint)fVar232;
  auVar303 = auVar303 | auVar399;
  auVar339 = rcpps(_DAT_01f4bd50,auVar330);
  fVar375 = auVar339._0_4_;
  auVar331._0_4_ = auVar330._0_4_ * fVar375;
  fVar378 = auVar339._4_4_;
  auVar331._4_4_ = auVar330._4_4_ * fVar378;
  fVar386 = auVar339._8_4_;
  auVar331._8_4_ = auVar330._8_4_ * fVar386;
  fVar390 = auVar339._12_4_;
  auVar331._12_4_ = auVar330._12_4_ * fVar390;
  fVar375 = (1.0 - auVar331._0_4_) * fVar375 + fVar375;
  fVar378 = (1.0 - auVar331._4_4_) * fVar378 + fVar378;
  fVar386 = (1.0 - auVar331._8_4_) * fVar386 + fVar386;
  fVar390 = (1.0 - auVar331._12_4_) * fVar390 + fVar390;
  auVar339 = rcpps(auVar331,auVar145);
  fVar355 = auVar339._0_4_;
  auVar146._0_4_ = auVar145._0_4_ * fVar355;
  fVar363 = auVar339._4_4_;
  auVar146._4_4_ = auVar145._4_4_ * fVar363;
  fVar370 = auVar339._8_4_;
  auVar146._8_4_ = auVar145._8_4_ * fVar370;
  fVar374 = auVar339._12_4_;
  auVar146._12_4_ = auVar145._12_4_ * fVar374;
  fVar355 = (1.0 - auVar146._0_4_) * fVar355 + fVar355;
  fVar363 = (1.0 - auVar146._4_4_) * fVar363 + fVar363;
  fVar370 = (1.0 - auVar146._8_4_) * fVar370 + fVar370;
  fVar374 = (1.0 - auVar146._12_4_) * fVar374 + fVar374;
  auVar339 = rcpps(auVar146,auVar303);
  fVar421 = auVar339._0_4_;
  auVar304._0_4_ = auVar303._0_4_ * fVar421;
  fVar140 = auVar339._4_4_;
  fVar184 = auVar303._4_4_ * fVar140;
  auVar301._0_8_ = CONCAT44(fVar184,auVar304._0_4_);
  fVar188 = auVar339._8_4_;
  auVar301._8_4_ = auVar303._8_4_ * fVar188;
  fVar268 = auVar339._12_4_;
  uVar12 = *(undefined8 *)(prim + uVar117 * 0x12 + 6);
  fVar421 = (1.0 - auVar304._0_4_) * fVar421 + fVar421;
  fVar140 = (1.0 - fVar184) * fVar140 + fVar140;
  fVar188 = (1.0 - auVar301._8_4_) * fVar188 + fVar188;
  fVar268 = (1.0 - auVar303._12_4_ * fVar268) * fVar268 + fVar268;
  uVar13 = *(ulong *)(prim + uVar117 * 0x16 + 6);
  uVar182 = (undefined2)(uVar120 >> 0x30);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar120;
  auVar197._12_2_ = uVar182;
  auVar197._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar120 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar120;
  auVar196._10_2_ = uVar182;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar182;
  auVar195._0_8_ = uVar120;
  uVar182 = (undefined2)(uVar120 >> 0x10);
  auVar97._4_8_ = auVar195._8_8_;
  auVar97._2_2_ = uVar182;
  auVar97._0_2_ = uVar182;
  auVar198._0_4_ = (float)(int)(short)uVar120;
  fVar297 = (float)(auVar97._0_4_ >> 0x10);
  auVar190._0_8_ = CONCAT44(fVar297,auVar198._0_4_);
  auVar190._8_4_ = (float)(auVar195._8_4_ >> 0x10);
  auVar307._12_2_ = (short)((uint)fVar184 >> 0x10);
  auVar307._0_12_ = auVar301;
  auVar307._14_2_ = (short)((ulong)uVar189 >> 0x30);
  auVar306._12_4_ = auVar307._12_4_;
  auVar306._0_10_ = auVar301._0_10_;
  auVar306._10_2_ = (short)((ulong)uVar189 >> 0x20);
  auVar305._10_6_ = auVar306._10_6_;
  auVar305._8_2_ = SUB42(fVar184,0);
  auVar305._0_8_ = auVar301._0_8_;
  auVar304._8_8_ = auVar305._8_8_;
  auVar304._6_2_ = (short)((ulong)uVar189 >> 0x10);
  auVar304._4_2_ = (short)((uint)auVar304._0_4_ >> 0x10);
  local_578._0_2_ = (undefined2)uVar10;
  local_578._2_2_ = (undefined2)((ulong)uVar10 >> 0x10);
  local_578._4_2_ = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_572 = (undefined2)((ulong)uVar10 >> 0x30);
  auVar201._12_2_ = (short)((uint)fVar297 >> 0x10);
  auVar201._0_12_ = auVar190;
  auVar201._14_2_ = uStack_572;
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._0_10_ = auVar190._0_10_;
  auVar200._10_2_ = local_578._4_2_;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = SUB42(fVar297,0);
  auVar199._0_8_ = auVar190._0_8_;
  auVar198._8_8_ = auVar199._8_8_;
  auVar198._6_2_ = local_578._2_2_;
  auVar198._4_2_ = (short)((uint)auVar198._0_4_ >> 0x10);
  auVar202._0_4_ = (float)(int)(short)local_578._0_2_;
  fVar298 = (float)(auVar198._4_4_ >> 0x10);
  auVar191._0_8_ = CONCAT44(fVar298,auVar202._0_4_);
  auVar191._8_4_ = (float)(auVar199._8_4_ >> 0x10);
  uVar182 = (undefined2)(uVar11 >> 0x30);
  auVar288._8_4_ = 0;
  auVar288._0_8_ = uVar11;
  auVar288._12_2_ = uVar182;
  auVar288._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar11 >> 0x20);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._8_2_ = 0;
  auVar287._0_8_ = uVar11;
  auVar287._10_2_ = uVar182;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = uVar182;
  auVar286._0_8_ = uVar11;
  uVar182 = (undefined2)(uVar11 >> 0x10);
  auVar98._4_8_ = auVar286._8_8_;
  auVar98._2_2_ = uVar182;
  auVar98._0_2_ = uVar182;
  auVar205._12_2_ = (short)((uint)fVar298 >> 0x10);
  auVar205._0_12_ = auVar191;
  auVar205._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._0_10_ = auVar191._0_10_;
  auVar204._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = SUB42(fVar298,0);
  auVar203._0_8_ = auVar191._0_8_;
  auVar202._8_8_ = auVar203._8_8_;
  auVar202._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar202._4_2_ = (short)((uint)auVar202._0_4_ >> 0x10);
  fVar324 = (float)(auVar202._4_4_ >> 0x10);
  fVar327 = (float)(auVar203._8_4_ >> 0x10);
  uVar182 = (undefined2)(uVar13 >> 0x30);
  auVar149._8_4_ = 0;
  auVar149._0_8_ = uVar13;
  auVar149._12_2_ = uVar182;
  auVar149._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar13 >> 0x20);
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._8_2_ = 0;
  auVar148._0_8_ = uVar13;
  auVar148._10_2_ = uVar182;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._8_2_ = uVar182;
  auVar147._0_8_ = uVar13;
  uVar182 = (undefined2)(uVar13 >> 0x10);
  auVar99._4_8_ = auVar147._8_8_;
  auVar99._2_2_ = uVar182;
  auVar99._0_2_ = uVar182;
  uVar120 = *(ulong *)(prim + uVar117 * 0x14 + 6);
  uVar182 = (undefined2)(uVar120 >> 0x30);
  auVar152._8_4_ = 0;
  auVar152._0_8_ = uVar120;
  auVar152._12_2_ = uVar182;
  auVar152._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar120 >> 0x20);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar120;
  auVar151._10_2_ = uVar182;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = uVar182;
  auVar150._0_8_ = uVar120;
  uVar182 = (undefined2)(uVar120 >> 0x10);
  auVar100._4_8_ = auVar150._8_8_;
  auVar100._2_2_ = uVar182;
  auVar100._0_2_ = uVar182;
  fVar184 = (float)(auVar100._0_4_ >> 0x10);
  fVar231 = (float)(auVar150._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar117 * 0x18 + 6);
  uVar182 = (undefined2)(uVar14 >> 0x30);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar14;
  auVar208._12_2_ = uVar182;
  auVar208._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar14 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar14;
  auVar207._10_2_ = uVar182;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar182;
  auVar206._0_8_ = uVar14;
  uVar182 = (undefined2)(uVar14 >> 0x10);
  auVar101._4_8_ = auVar206._8_8_;
  auVar101._2_2_ = uVar182;
  auVar101._0_2_ = uVar182;
  uVar15 = *(ulong *)(prim + uVar117 * 0x1d + 6);
  uVar182 = (undefined2)(uVar15 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar15;
  auVar155._12_2_ = uVar182;
  auVar155._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar15 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar15;
  auVar154._10_2_ = uVar182;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar182;
  auVar153._0_8_ = uVar15;
  uVar182 = (undefined2)(uVar15 >> 0x10);
  auVar102._4_8_ = auVar153._8_8_;
  auVar102._2_2_ = uVar182;
  auVar102._0_2_ = uVar182;
  fVar186 = (float)(auVar102._0_4_ >> 0x10);
  fVar232 = (float)(auVar153._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar117 * 0x21 + 6);
  uVar182 = (undefined2)(uVar16 >> 0x30);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar16;
  auVar211._12_2_ = uVar182;
  auVar211._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar16 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar16;
  auVar210._10_2_ = uVar182;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar182;
  auVar209._0_8_ = uVar16;
  uVar182 = (undefined2)(uVar16 >> 0x10);
  auVar103._4_8_ = auVar209._8_8_;
  auVar103._2_2_ = uVar182;
  auVar103._0_2_ = uVar182;
  uVar17 = *(ulong *)(prim + uVar117 * 0x1f + 6);
  uVar182 = (undefined2)(uVar17 >> 0x30);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar17;
  auVar158._12_2_ = uVar182;
  auVar158._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar17 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar17;
  auVar157._10_2_ = uVar182;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar182;
  auVar156._0_8_ = uVar17;
  uVar182 = (undefined2)(uVar17 >> 0x10);
  auVar104._4_8_ = auVar156._8_8_;
  auVar104._2_2_ = uVar182;
  auVar104._0_2_ = uVar182;
  fVar187 = (float)(auVar104._0_4_ >> 0x10);
  fVar264 = (float)(auVar156._8_4_ >> 0x10);
  uVar117 = *(ulong *)(prim + uVar117 * 0x23 + 6);
  uVar182 = (undefined2)(uVar117 >> 0x30);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar117;
  auVar214._12_2_ = uVar182;
  auVar214._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar117 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar117;
  auVar213._10_2_ = uVar182;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar182;
  auVar212._0_8_ = uVar117;
  uVar182 = (undefined2)(uVar117 >> 0x10);
  auVar105._4_8_ = auVar212._8_8_;
  auVar105._2_2_ = uVar182;
  auVar105._0_2_ = uVar182;
  auVar308._0_8_ =
       CONCAT44(((((float)(auVar304._4_4_ >> 0x10) - fVar297) * fVar235 + fVar297) - fVar418) *
                fVar378,((((float)(int)(short)uVar189 - auVar198._0_4_) * fVar235 + auVar198._0_4_)
                        - fVar417) * fVar375);
  auVar308._8_4_ =
       ((((float)(auVar305._8_4_ >> 0x10) - auVar190._8_4_) * fVar235 + auVar190._8_4_) - fVar422) *
       fVar386;
  auVar308._12_4_ =
       ((((float)(auVar306._12_4_ >> 0x10) - (float)(auVar196._12_4_ >> 0x10)) * fVar235 +
        (float)(auVar196._12_4_ >> 0x10)) - fVar425) * fVar390;
  auVar332._0_4_ =
       ((((float)(int)(short)uVar11 - auVar202._0_4_) * fVar235 + auVar202._0_4_) - fVar417) *
       fVar375;
  auVar332._4_4_ =
       ((((float)(auVar98._0_4_ >> 0x10) - fVar298) * fVar235 + fVar298) - fVar418) * fVar378;
  auVar332._8_4_ =
       ((((float)(auVar286._8_4_ >> 0x10) - auVar191._8_4_) * fVar235 + auVar191._8_4_) - fVar422) *
       fVar386;
  auVar332._12_4_ =
       ((((float)(auVar287._12_4_ >> 0x10) - (float)(auVar200._12_4_ >> 0x10)) * fVar235 +
        (float)(auVar200._12_4_ >> 0x10)) - fVar425) * fVar390;
  auVar340._0_8_ =
       CONCAT44(((((float)(auVar99._0_4_ >> 0x10) - fVar324) * fVar235 + fVar324) - fVar347) *
                fVar363,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar235 +
                         (float)(int)(short)uVar12) - fVar338) * fVar355);
  auVar340._8_4_ =
       ((((float)(auVar147._8_4_ >> 0x10) - fVar327) * fVar235 + fVar327) - fVar348) * fVar370;
  auVar340._12_4_ =
       ((((float)(auVar148._12_4_ >> 0x10) - (float)(auVar204._12_4_ >> 0x10)) * fVar235 +
        (float)(auVar204._12_4_ >> 0x10)) - fVar354) * fVar374;
  auVar382._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar120) * fVar235 +
        (float)(int)(short)uVar120) - fVar338) * fVar355;
  auVar382._4_4_ =
       ((((float)(auVar101._0_4_ >> 0x10) - fVar184) * fVar235 + fVar184) - fVar347) * fVar363;
  auVar382._8_4_ =
       ((((float)(auVar206._8_4_ >> 0x10) - fVar231) * fVar235 + fVar231) - fVar348) * fVar370;
  auVar382._12_4_ =
       ((((float)(auVar207._12_4_ >> 0x10) - (float)(auVar151._12_4_ >> 0x10)) * fVar235 +
        (float)(auVar151._12_4_ >> 0x10)) - fVar354) * fVar374;
  auVar400._0_8_ =
       CONCAT44(((((float)(auVar103._0_4_ >> 0x10) - fVar186) * fVar235 + fVar186) - fVar450) *
                fVar140,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar235 +
                         (float)(int)(short)uVar15) - fVar444) * fVar421);
  auVar400._8_4_ =
       ((((float)(auVar209._8_4_ >> 0x10) - fVar232) * fVar235 + fVar232) - fVar453) * fVar188;
  auVar400._12_4_ =
       ((((float)(auVar210._12_4_ >> 0x10) - (float)(auVar154._12_4_ >> 0x10)) * fVar235 +
        (float)(auVar154._12_4_ >> 0x10)) - fVar439) * fVar268;
  auVar414._0_4_ =
       ((((float)(int)(short)uVar117 - (float)(int)(short)uVar17) * fVar235 +
        (float)(int)(short)uVar17) - fVar444) * fVar421;
  auVar414._4_4_ =
       ((((float)(auVar105._0_4_ >> 0x10) - fVar187) * fVar235 + fVar187) - fVar450) * fVar140;
  auVar414._8_4_ =
       ((((float)(auVar212._8_4_ >> 0x10) - fVar264) * fVar235 + fVar264) - fVar453) * fVar188;
  auVar414._12_4_ =
       ((((float)(auVar213._12_4_ >> 0x10) - (float)(auVar157._12_4_ >> 0x10)) * fVar235 +
        (float)(auVar157._12_4_ >> 0x10)) - fVar439) * fVar268;
  auVar250._8_4_ = auVar308._8_4_;
  auVar250._0_8_ = auVar308._0_8_;
  auVar250._12_4_ = auVar308._12_4_;
  auVar251 = minps(auVar250,auVar332);
  auVar159._8_4_ = auVar340._8_4_;
  auVar159._0_8_ = auVar340._0_8_;
  auVar159._12_4_ = auVar340._12_4_;
  auVar339 = minps(auVar159,auVar382);
  auVar251 = maxps(auVar251,auVar339);
  auVar160._8_4_ = auVar400._8_4_;
  auVar160._0_8_ = auVar400._0_8_;
  auVar160._12_4_ = auVar400._12_4_;
  auVar339 = minps(auVar160,auVar414);
  uVar121 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar215._4_4_ = uVar121;
  auVar215._0_4_ = uVar121;
  auVar215._8_4_ = uVar121;
  auVar215._12_4_ = uVar121;
  auVar339 = maxps(auVar339,auVar215);
  auVar339 = maxps(auVar251,auVar339);
  fVar140 = auVar339._0_4_ * 0.99999964;
  fVar184 = auVar339._4_4_ * 0.99999964;
  fVar186 = auVar339._8_4_ * 0.99999964;
  fVar187 = auVar339._12_4_ * 0.99999964;
  auVar339 = maxps(auVar308,auVar332);
  auVar251 = maxps(auVar340,auVar382);
  auVar339 = minps(auVar339,auVar251);
  auVar251 = maxps(auVar400,auVar414);
  fVar421 = (ray->super_RayK<1>).tfar;
  auVar216._4_4_ = fVar421;
  auVar216._0_4_ = fVar421;
  auVar216._8_4_ = fVar421;
  auVar216._12_4_ = fVar421;
  auVar251 = minps(auVar251,auVar216);
  auVar339 = minps(auVar339,auVar251);
  auVar217._0_4_ = -(uint)(PVar19 != (Primitive)0x0 && fVar140 <= auVar339._0_4_ * 1.0000004);
  auVar217._4_4_ = -(uint)(1 < (byte)PVar19 && fVar184 <= auVar339._4_4_ * 1.0000004);
  auVar217._8_4_ = -(uint)(2 < (byte)PVar19 && fVar186 <= auVar339._8_4_ * 1.0000004);
  auVar217._12_4_ = -(uint)(3 < (byte)PVar19 && fVar187 <= auVar339._12_4_ * 1.0000004);
  uVar121 = movmskps((int)prim,auVar217);
  local_310 = CONCAT44((int)((ulong)prim >> 0x20),uVar121);
  auVar218._0_12_ = mm_lookupmask_ps._240_12_;
  auVar218._12_4_ = 0;
  local_318 = prim;
LAB_003b65b9:
  if (local_310 == 0) {
    return;
  }
  lVar127 = 0;
  if (local_310 != 0) {
    for (; (local_310 >> lVar127 & 1) == 0; lVar127 = lVar127 + 1) {
    }
  }
  uVar130 = *(uint *)(local_318 + 2);
  uVar132 = *(uint *)(local_318 + lVar127 * 4 + 6);
  pGVar26 = (context->scene->geometries).items[uVar130].ptr;
  uVar120 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                            (ulong)uVar132 *
                            pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar421 = pGVar26->fnumTimeSegments;
  fVar188 = (pGVar26->time_range).lower;
  fVar231 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar188) /
            ((pGVar26->time_range).upper - fVar188)) * fVar421;
  fVar188 = floorf(fVar231);
  fVar421 = fVar421 + -1.0;
  if (fVar421 <= fVar188) {
    fVar188 = fVar421;
  }
  fVar421 = 0.0;
  if (0.0 <= fVar188) {
    fVar421 = fVar188;
  }
  fVar231 = fVar231 - fVar421;
  fVar268 = 1.0 - fVar231;
  _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar128 = (long)(int)fVar421 * 0x38;
  pRVar124 = *(RTCIntersectArguments **)(_Var27 + lVar128);
  lVar127 = *(long *)(_Var27 + 0x10 + lVar128);
  lVar28 = *(long *)(_Var27 + 0x38 + lVar128);
  lVar128 = *(long *)(_Var27 + 0x48 + lVar128);
  pRVar122 = (RTCIntersectArguments *)(lVar128 * (uVar120 + 3));
  pfVar1 = (float *)(lVar28 + uVar120 * lVar128);
  pRVar2 = (RTCRayQueryFlags *)((long)&pRVar124->flags + lVar127 * uVar120);
  local_268 = (float)*pRVar2 * fVar268 + *pfVar1 * fVar231;
  fVar347 = (float)pRVar2[1] * fVar268 + pfVar1[1] * fVar231;
  local_278 = (float)pRVar2[2] * fVar268 + pfVar1[2] * fVar231;
  pfVar3 = (float *)(lVar28 + (uVar120 + 1) * lVar128);
  pRVar4 = (RTCRayQueryFlags *)((long)&pRVar124->flags + lVar127 * (uVar120 + 1));
  fVar354 = (float)*pRVar4 * fVar268 + *pfVar3 * fVar231;
  fVar355 = (float)pRVar4[1] * fVar268 + pfVar3[1] * fVar231;
  fVar363 = (float)pRVar4[2] * fVar268 + pfVar3[2] * fVar231;
  pfVar5 = (float *)(lVar28 + (uVar120 + 2) * lVar128);
  pRVar6 = (RTCRayQueryFlags *)((long)&pRVar124->flags + lVar127 * (uVar120 + 2));
  pRVar7 = (RTCRayQueryFlags *)((long)&pRVar124->flags + lVar127 * (uVar120 + 3));
  local_578._0_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar421 = (ray->super_RayK<1>).org.field_0.m128[1];
  fStack_570 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_338 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar188 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar232 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar264 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar297 = local_338 * local_338;
  fVar298 = fVar188 * fVar188;
  fVar327 = fVar232 * fVar232;
  fVar264 = fVar264 * fVar264;
  fVar324 = fVar297 + fVar298 + fVar327;
  auVar333._0_8_ = CONCAT44(fVar298 + fVar298 + fVar264,fVar324);
  auVar333._8_4_ = fVar327 + fVar298 + fVar327;
  auVar333._12_4_ = fVar264 + fVar298 + fVar264;
  auVar309._8_4_ = auVar333._8_4_;
  auVar309._0_8_ = auVar333._0_8_;
  auVar309._12_4_ = auVar333._12_4_;
  auVar339 = rcpss(auVar309,auVar333);
  fVar338 = (2.0 - fVar324 * auVar339._0_4_) * auVar339._0_4_ *
            (((local_278 + fVar363) * 0.5 - fStack_570) * fVar232 +
            ((fVar347 + fVar355) * 0.5 - fVar421) * fVar188 +
            ((local_268 + fVar354) * 0.5 - (float)local_578._0_4_) * local_338);
  local_328 = ZEXT416((uint)fVar338);
  local_578._0_4_ = local_338 * fVar338 + (float)local_578._0_4_;
  fVar421 = fVar188 * fVar338 + fVar421;
  fStack_570 = fVar232 * fVar338 + fStack_570;
  local_268 = local_268 - (float)local_578._0_4_;
  fVar347 = fVar347 - fVar421;
  local_278 = local_278 - fStack_570;
  fVar348 = ((float)pRVar2[3] * fVar268 + pfVar1[3] * fVar231) - 0.0;
  fVar374 = ((float)*pRVar6 * fVar268 + *pfVar5 * fVar231) - (float)local_578._0_4_;
  fVar375 = ((float)pRVar6[1] * fVar268 + pfVar5[1] * fVar231) - fVar421;
  fVar378 = ((float)pRVar6[2] * fVar268 + pfVar5[2] * fVar231) - fStack_570;
  fVar386 = ((float)pRVar6[3] * fVar268 + pfVar5[3] * fVar231) - 0.0;
  pfVar1 = (float *)((long)&pRVar122->flags + lVar28);
  fVar354 = fVar354 - (float)local_578._0_4_;
  fVar355 = fVar355 - fVar421;
  fVar363 = fVar363 - fStack_570;
  fVar370 = ((float)pRVar4[3] * fVar268 + pfVar3[3] * fVar231) - 0.0;
  local_578._0_4_ = (fVar231 * *pfVar1 + fVar268 * (float)*pRVar7) - (float)local_578._0_4_;
  fVar421 = (fVar231 * pfVar1[1] + fVar268 * (float)pRVar7[1]) - fVar421;
  fStack_570 = (fVar231 * pfVar1[2] + fVar268 * (float)pRVar7[2]) - fStack_570;
  fStack_56c = (fVar231 * pfVar1[3] + fVar268 * (float)pRVar7[3]) - 0.0;
  fStack_264 = local_268;
  fStack_260 = local_268;
  fStack_25c = local_268;
  fStack_274 = local_278;
  fStack_270 = local_278;
  fStack_26c = local_278;
  local_4c8._4_4_ = fVar347;
  local_4c8._0_4_ = local_268;
  fStack_4c0 = local_278;
  fStack_4bc = fVar348;
  local_288 = fVar354;
  fStack_284 = fVar354;
  fStack_280 = fVar354;
  fStack_27c = fVar354;
  local_298 = fVar355;
  fStack_294 = fVar355;
  fStack_290 = fVar355;
  fStack_28c = fVar355;
  local_2a8 = fVar363;
  fStack_2a4 = fVar363;
  fStack_2a0 = fVar363;
  fStack_29c = fVar363;
  fVar268 = fVar297 + fVar327 + fVar298;
  fVar324 = fVar297 + fVar327 + fVar298;
  fVar235 = fVar297 + fVar327 + fVar298;
  fVar297 = fVar297 + fVar327 + fVar298;
  local_2b8 = fVar386;
  fStack_2b4 = fVar386;
  fStack_2b0 = fVar386;
  fStack_2ac = fVar386;
  local_2c8 = fVar421;
  fStack_2c4 = fVar421;
  fStack_2c0 = fVar421;
  fStack_2bc = fVar421;
  local_2d8 = fStack_570;
  fStack_2d4 = fStack_570;
  fStack_2d0 = fStack_570;
  fStack_2cc = fStack_570;
  stack0xfffffffffffffa8c = fVar421;
  local_2e8 = fStack_56c;
  fStack_2e4 = fStack_56c;
  fStack_2e0 = fStack_56c;
  fStack_2dc = fStack_56c;
  fStack_334 = local_338;
  fStack_330 = local_338;
  fStack_32c = local_338;
  local_308 = ABS(fVar268);
  fStack_304 = ABS(fVar324);
  fStack_300 = ABS(fVar235);
  fStack_2fc = ABS(fVar297);
  pSVar118 = (StackEntry *)0x1;
  local_60c = 1.4013e-45;
  fVar231 = 0.0;
  fVar264 = 1.0;
  local_2f8 = (float)local_578._0_4_;
  fStack_2f4 = (float)local_578._0_4_;
  fStack_2f0 = (float)local_578._0_4_;
  fStack_2ec = (float)local_578._0_4_;
  pRVar125 = (RTCIntersectArguments *)0x0;
  do {
    fVar440 = fVar264 - fVar231;
    fVar411 = fVar440 * 0.0 + fVar231;
    fVar417 = fVar440 * 0.33333334 + fVar231;
    fVar418 = fVar440 * 0.6666667 + fVar231;
    fVar441 = fVar440 * 1.0 + fVar231;
    fVar450 = 1.0 - fVar411;
    fVar364 = 1.0 - fVar417;
    fVar366 = 1.0 - fVar418;
    fVar368 = 1.0 - fVar441;
    fVar327 = fVar411 * 3.0;
    fVar390 = fVar417 * 3.0;
    fVar397 = fVar418 * 3.0;
    fVar407 = fVar441 * 3.0;
    fVar444 = ((fVar450 * 3.0 + -5.0) * fVar450 * fVar450 + 2.0) * 0.5;
    fVar453 = ((fVar364 * 3.0 + -5.0) * fVar364 * fVar364 + 2.0) * 0.5;
    fVar376 = ((fVar366 * 3.0 + -5.0) * fVar366 * fVar366 + 2.0) * 0.5;
    fVar377 = ((fVar368 * 3.0 + -5.0) * fVar368 * fVar368 + 2.0) * 0.5;
    fVar405 = -fVar450 * fVar411 * fVar411 * 0.5;
    fVar422 = -fVar364 * fVar417 * fVar417 * 0.5;
    fVar425 = -fVar366 * fVar418 * fVar418 * 0.5;
    fVar439 = -fVar368 * fVar441 * fVar441 * 0.5;
    fVar379 = (fVar411 * fVar411 * (fVar327 + -5.0) + 2.0) * 0.5;
    fVar387 = (fVar417 * fVar417 * (fVar390 + -5.0) + 2.0) * 0.5;
    fVar391 = (fVar418 * fVar418 * (fVar397 + -5.0) + 2.0) * 0.5;
    fVar394 = (fVar441 * fVar441 * (fVar407 + -5.0) + 2.0) * 0.5;
    fVar298 = fVar440 * 0.11111111;
    fVar445 = -fVar411 * fVar450 * fVar450 * 0.5;
    fVar451 = -fVar417 * fVar364 * fVar364 * 0.5;
    fVar454 = -fVar418 * fVar366 * fVar366 * 0.5;
    fVar455 = -fVar441 * fVar368 * fVar368 * 0.5;
    fVar299 = local_268 * fVar445 + local_288 * fVar379 + fVar374 * fVar444 + local_2f8 * fVar405;
    fVar322 = fStack_264 * fVar451 + fStack_284 * fVar387 + fVar374 * fVar453 + fStack_2f4 * fVar422
    ;
    fVar325 = fStack_260 * fVar454 + fStack_280 * fVar391 + fVar374 * fVar376 + fStack_2f0 * fVar425
    ;
    fVar328 = fStack_25c * fVar455 + fStack_27c * fVar394 + fVar374 * fVar377 + fStack_2ec * fVar439
    ;
    fVar300 = fVar347 * fVar445 + local_298 * fVar379 + fVar375 * fVar444 + local_2c8 * fVar405;
    fVar323 = fVar347 * fVar451 + fStack_294 * fVar387 + fVar375 * fVar453 + fStack_2c4 * fVar422;
    fVar326 = fVar347 * fVar454 + fStack_290 * fVar391 + fVar375 * fVar376 + fStack_2c0 * fVar425;
    fVar329 = fVar347 * fVar455 + fStack_28c * fVar394 + fVar375 * fVar377 + fStack_2bc * fVar439;
    fVar412 = local_278 * fVar445 + local_2a8 * fVar379 + fVar378 * fVar444 + local_2d8 * fVar405;
    fVar419 = fStack_274 * fVar451 + fStack_2a4 * fVar387 + fVar378 * fVar453 + fStack_2d4 * fVar422
    ;
    fVar423 = fStack_270 * fVar454 + fStack_2a0 * fVar391 + fVar378 * fVar376 + fStack_2d0 * fVar425
    ;
    fVar426 = fStack_26c * fVar455 + fStack_29c * fVar394 + fVar378 * fVar377 + fStack_2cc * fVar439
    ;
    fVar446 = fVar445 * fVar348 + fVar379 * fVar370 + fVar444 * local_2b8 + fVar405 * local_2e8;
    fVar452 = fVar451 * fVar348 + fVar387 * fVar370 + fVar453 * fStack_2b4 + fVar422 * fStack_2e4;
    auVar447._0_8_ = CONCAT44(fVar452,fVar446);
    auVar447._8_4_ =
         fVar454 * fVar348 + fVar391 * fVar370 + fVar376 * fStack_2b0 + fVar425 * fStack_2e0;
    auVar447._12_4_ =
         fVar455 * fVar348 + fVar394 * fVar370 + fVar377 * fStack_2ac + fVar439 * fStack_2dc;
    fVar453 = fVar411 * (fVar450 + fVar450);
    fVar377 = fVar417 * (fVar364 + fVar364);
    fVar387 = fVar418 * (fVar366 + fVar366);
    fVar394 = fVar441 * (fVar368 + fVar368);
    fVar376 = (fVar453 - fVar450 * fVar450) * 0.5;
    fVar379 = (fVar377 - fVar364 * fVar364) * 0.5;
    fVar391 = (fVar387 - fVar366 * fVar366) * 0.5;
    fVar445 = (fVar394 - fVar368 * fVar368) * 0.5;
    fVar422 = (fVar411 * fVar327 + (fVar411 + fVar411) * (fVar327 + -5.0)) * 0.5;
    fVar425 = (fVar417 * fVar390 + (fVar417 + fVar417) * (fVar390 + -5.0)) * 0.5;
    fVar439 = (fVar418 * fVar397 + (fVar418 + fVar418) * (fVar397 + -5.0)) * 0.5;
    fVar444 = (fVar441 * fVar407 + (fVar441 + fVar441) * (fVar407 + -5.0)) * 0.5;
    fVar405 = ((fVar327 + 2.0) * (fVar450 + fVar450) - fVar450 * 3.0 * fVar450) * 0.5;
    fVar327 = ((fVar390 + 2.0) * (fVar364 + fVar364) - fVar364 * 3.0 * fVar364) * 0.5;
    fVar390 = ((fVar397 + 2.0) * (fVar366 + fVar366) - fVar366 * 3.0 * fVar366) * 0.5;
    fVar397 = ((fVar407 + 2.0) * (fVar368 + fVar368) - fVar368 * 3.0 * fVar368) * 0.5;
    fVar407 = (fVar411 * fVar411 - fVar453) * 0.5;
    fVar411 = (fVar417 * fVar417 - fVar377) * 0.5;
    fVar417 = (fVar418 * fVar418 - fVar387) * 0.5;
    fVar418 = (fVar441 * fVar441 - fVar394) * 0.5;
    fVar394 = (local_268 * fVar376 + local_288 * fVar422 + fVar374 * fVar405 + local_2f8 * fVar407)
              * fVar298;
    fVar451 = (fStack_264 * fVar379 +
              fStack_284 * fVar425 + fVar374 * fVar327 + fStack_2f4 * fVar411) * fVar298;
    fVar454 = (fStack_260 * fVar391 +
              fStack_280 * fVar439 + fVar374 * fVar390 + fStack_2f0 * fVar417) * fVar298;
    fVar455 = (fStack_25c * fVar445 +
              fStack_27c * fVar444 + fVar374 * fVar397 + fStack_2ec * fVar418) * fVar298;
    fVar380 = (fVar347 * fVar376 + local_298 * fVar422 + fVar375 * fVar405 + local_2c8 * fVar407) *
              fVar298;
    fVar388 = (fVar347 * fVar379 + fStack_294 * fVar425 + fVar375 * fVar327 + fStack_2c4 * fVar411)
              * fVar298;
    fVar392 = (fVar347 * fVar391 + fStack_290 * fVar439 + fVar375 * fVar390 + fStack_2c0 * fVar417)
              * fVar298;
    fVar395 = (fVar347 * fVar445 + fStack_28c * fVar444 + fVar375 * fVar397 + fStack_2bc * fVar418)
              * fVar298;
    fVar398 = (local_278 * fVar376 + local_2a8 * fVar422 + fVar378 * fVar405 + local_2d8 * fVar407)
              * fVar298;
    fVar406 = (fStack_274 * fVar379 +
              fStack_2a4 * fVar425 + fVar378 * fVar327 + fStack_2d4 * fVar411) * fVar298;
    fVar408 = (fStack_270 * fVar391 +
              fStack_2a0 * fVar439 + fVar378 * fVar390 + fStack_2d0 * fVar417) * fVar298;
    fVar409 = (fStack_26c * fVar445 +
              fStack_29c * fVar444 + fVar378 * fVar397 + fStack_2cc * fVar418) * fVar298;
    fVar327 = fVar298 * (fVar379 * fVar348 +
                        fVar425 * fVar370 + fVar327 * fStack_2b4 + fVar411 * fStack_2e4);
    fVar390 = fVar298 * (fVar391 * fVar348 +
                        fVar439 * fVar370 + fVar390 * fStack_2b0 + fVar417 * fStack_2e0);
    fVar397 = fVar298 * (fVar445 * fVar348 +
                        fVar444 * fVar370 + fVar397 * fStack_2ac + fVar418 * fStack_2dc);
    auVar349._4_4_ = auVar447._8_4_;
    auVar349._0_4_ = fVar452;
    auVar349._8_4_ = auVar447._12_4_;
    auVar349._12_4_ = 0;
    local_628._4_4_ = fVar452 + fVar327;
    local_628._0_4_ =
         fVar446 + fVar298 * (fVar376 * fVar348 +
                             fVar422 * fVar370 + fVar405 * local_2b8 + fVar407 * local_2e8);
    fStack_620 = auVar447._8_4_ + fVar390;
    fStack_61c = auVar447._12_4_ + fVar397;
    auVar357._0_8_ = CONCAT44(auVar447._8_4_ - fVar390,fVar452 - fVar327);
    auVar357._8_4_ = auVar447._12_4_ - fVar397;
    auVar357._12_4_ = 0;
    local_348._0_4_ = fVar323 - fVar300;
    local_348._4_4_ = fVar326 - fVar323;
    fStack_340 = fVar329 - fVar326;
    fStack_33c = 0.0 - fVar329;
    local_358 = fVar419 - fVar412;
    fStack_354 = fVar423 - fVar419;
    fStack_350 = fVar426 - fVar423;
    fStack_34c = 0.0 - fVar426;
    fVar444 = fVar380 * local_358 - fVar398 * (float)local_348._0_4_;
    fVar453 = fVar388 * fStack_354 - fVar406 * (float)local_348._4_4_;
    fVar364 = fVar392 * fStack_350 - fVar408 * fStack_340;
    fVar379 = fVar395 * fStack_34c - fVar409 * fStack_33c;
    fVar441 = fVar322 - fVar299;
    fVar450 = fVar325 - fVar322;
    fVar376 = fVar328 - fVar325;
    fVar377 = 0.0 - fVar328;
    fVar405 = fVar398 * fVar441 - fVar394 * local_358;
    fVar411 = fVar406 * fVar450 - fVar451 * fStack_354;
    fVar418 = fVar408 * fVar376 - fVar454 * fStack_350;
    fVar425 = fVar409 * fVar377 - fVar455 * fStack_34c;
    fVar366 = fVar394 * (float)local_348._0_4_ - fVar380 * fVar441;
    fVar387 = fVar451 * (float)local_348._4_4_ - fVar388 * fVar450;
    fVar391 = fVar454 * fStack_340 - fVar392 * fVar376;
    fVar368 = fVar455 * fStack_33c - fVar395 * fVar377;
    auVar219._0_4_ = local_358 * local_358;
    auVar219._4_4_ = fStack_354 * fStack_354;
    auVar219._8_4_ = fStack_350 * fStack_350;
    auVar219._12_4_ = fStack_34c * fStack_34c;
    auVar371._0_4_ =
         fVar441 * fVar441 + (float)local_348._0_4_ * (float)local_348._0_4_ + auVar219._0_4_;
    auVar371._4_4_ =
         fVar450 * fVar450 + (float)local_348._4_4_ * (float)local_348._4_4_ + auVar219._4_4_;
    auVar371._8_4_ = fVar376 * fVar376 + fStack_340 * fStack_340 + auVar219._8_4_;
    auVar371._12_4_ = fVar377 * fVar377 + fStack_33c * fStack_33c + auVar219._12_4_;
    auVar339 = rcpps(auVar219,auVar371);
    fVar298 = auVar339._0_4_;
    fVar327 = auVar339._4_4_;
    fVar390 = auVar339._8_4_;
    fVar397 = auVar339._12_4_;
    fVar298 = (1.0 - fVar298 * auVar371._0_4_) * fVar298 + fVar298;
    fVar327 = (1.0 - fVar327 * auVar371._4_4_) * fVar327 + fVar327;
    fVar390 = (1.0 - fVar390 * auVar371._8_4_) * fVar390 + fVar390;
    fVar397 = (1.0 - fVar397 * auVar371._12_4_) * fVar397 + fVar397;
    fVar407 = local_358 * fVar388 - (float)local_348._0_4_ * fVar406;
    fVar417 = fStack_354 * fVar392 - (float)local_348._4_4_ * fVar408;
    fVar422 = fStack_350 * fVar395 - fStack_340 * fVar409;
    fVar439 = fStack_34c * 0.0 - fStack_33c * 0.0;
    fVar445 = fVar441 * fVar406 - local_358 * fVar451;
    fVar446 = fVar450 * fVar408 - fStack_354 * fVar454;
    fVar452 = fVar376 * fVar409 - fStack_350 * fVar455;
    fVar410 = fVar377 * 0.0 - fStack_34c * 0.0;
    fVar428 = (float)local_348._0_4_ * fVar451 - fVar441 * fVar388;
    fVar433 = (float)local_348._4_4_ * fVar454 - fVar450 * fVar392;
    fVar435 = fStack_340 * fVar455 - fVar376 * fVar395;
    fVar437 = fStack_33c * 0.0 - fVar377 * 0.0;
    auVar310._0_4_ = (fVar444 * fVar444 + fVar405 * fVar405 + fVar366 * fVar366) * fVar298;
    auVar310._4_4_ = (fVar453 * fVar453 + fVar411 * fVar411 + fVar387 * fVar387) * fVar327;
    auVar310._8_4_ = (fVar364 * fVar364 + fVar418 * fVar418 + fVar391 * fVar391) * fVar390;
    auVar310._12_4_ = (fVar379 * fVar379 + fVar425 * fVar425 + fVar368 * fVar368) * fVar397;
    auVar252._0_4_ = (fVar407 * fVar407 + fVar445 * fVar445 + fVar428 * fVar428) * fVar298;
    auVar252._4_4_ = (fVar417 * fVar417 + fVar446 * fVar446 + fVar433 * fVar433) * fVar327;
    auVar252._8_4_ = (fVar422 * fVar422 + fVar452 * fVar452 + fVar435 * fVar435) * fVar390;
    auVar252._12_4_ = (fVar439 * fVar439 + fVar410 * fVar410 + fVar437 * fVar437) * fVar397;
    auVar251 = maxps(auVar310,auVar252);
    auVar341._8_4_ = auVar447._8_4_;
    auVar341._0_8_ = auVar447._0_8_;
    auVar341._12_4_ = auVar447._12_4_;
    auVar342 = maxps(auVar341,_local_628);
    auVar253._8_4_ = auVar357._8_4_;
    auVar253._0_8_ = auVar357._0_8_;
    auVar253._12_4_ = 0;
    auVar339 = maxps(auVar253,auVar349);
    auVar342 = maxps(auVar342,auVar339);
    auVar448 = minps(auVar447,_local_628);
    auVar358 = minps(auVar357,auVar349);
    auVar358 = minps(auVar448,auVar358);
    auVar339 = sqrtps(auVar339,auVar251);
    auVar251 = rsqrtps(auVar339,auVar371);
    fVar298 = auVar251._0_4_;
    fVar327 = auVar251._4_4_;
    fVar390 = auVar251._8_4_;
    fVar397 = auVar251._12_4_;
    fVar444 = fVar298 * 1.5 - fVar298 * fVar298 * auVar371._0_4_ * 0.5 * fVar298;
    fVar453 = fVar327 * 1.5 - fVar327 * fVar327 * auVar371._4_4_ * 0.5 * fVar327;
    fVar364 = fVar390 * 1.5 - fVar390 * fVar390 * auVar371._8_4_ * 0.5 * fVar390;
    fVar379 = fVar397 * 1.5 - fVar397 * fVar397 * auVar371._12_4_ * 0.5 * fVar397;
    fVar413 = 0.0 - fVar300;
    fVar420 = 0.0 - fVar323;
    fVar424 = 0.0 - fVar326;
    fVar427 = 0.0 - fVar329;
    fVar405 = 0.0 - fVar412;
    fVar411 = 0.0 - fVar419;
    fVar418 = 0.0 - fVar423;
    fVar425 = 0.0 - fVar426;
    auVar403._4_4_ = fVar188;
    auVar403._0_4_ = fVar188;
    auVar403._8_4_ = fVar188;
    auVar403._12_4_ = fVar188;
    fVar429 = 0.0 - fVar299;
    fVar434 = 0.0 - fVar322;
    fVar436 = 0.0 - fVar325;
    fVar438 = 0.0 - fVar328;
    fVar298 = local_338 * fVar441 * fVar444 +
              fVar188 * (float)local_348._0_4_ * fVar444 + fVar232 * local_358 * fVar444;
    fVar327 = fStack_334 * fVar450 * fVar453 +
              fVar188 * (float)local_348._4_4_ * fVar453 + fVar232 * fStack_354 * fVar453;
    fVar390 = fStack_330 * fVar376 * fVar364 +
              fVar188 * fStack_340 * fVar364 + fVar232 * fStack_350 * fVar364;
    fVar397 = fStack_32c * fVar377 * fVar379 +
              fVar188 * fStack_33c * fVar379 + fVar232 * fStack_34c * fVar379;
    fVar428 = fVar441 * fVar444 * fVar429 +
              (float)local_348._0_4_ * fVar444 * fVar413 + local_358 * fVar444 * fVar405;
    fVar433 = fVar450 * fVar453 * fVar434 +
              (float)local_348._4_4_ * fVar453 * fVar420 + fStack_354 * fVar453 * fVar411;
    fVar435 = fVar376 * fVar364 * fVar436 +
              fStack_340 * fVar364 * fVar424 + fStack_350 * fVar364 * fVar418;
    fVar437 = fVar377 * fVar379 * fVar438 +
              fStack_33c * fVar379 * fVar427 + fStack_34c * fVar379 * fVar425;
    fVar381 = (local_338 * fVar429 + fVar188 * fVar413 + fVar232 * fVar405) - fVar298 * fVar428;
    fVar389 = (fStack_334 * fVar434 + fVar188 * fVar420 + fVar232 * fVar411) - fVar327 * fVar433;
    fVar393 = (fStack_330 * fVar436 + fVar188 * fVar424 + fVar232 * fVar418) - fVar390 * fVar435;
    fVar396 = (fStack_32c * fVar438 + fVar188 * fVar427 + fVar232 * fVar425) - fVar397 * fVar437;
    fVar445 = (fVar429 * fVar429 + fVar413 * fVar413 + fVar405 * fVar405) - fVar428 * fVar428;
    fVar446 = (fVar434 * fVar434 + fVar420 * fVar420 + fVar411 * fVar411) - fVar433 * fVar433;
    fVar452 = (fVar436 * fVar436 + fVar424 * fVar424 + fVar418 * fVar418) - fVar435 * fVar435;
    fVar410 = (fVar438 * fVar438 + fVar427 * fVar427 + fVar425 * fVar425) - fVar437 * fVar437;
    fVar407 = (auVar342._0_4_ + auVar339._0_4_) * 1.0000002;
    fVar417 = (auVar342._4_4_ + auVar339._4_4_) * 1.0000002;
    fVar422 = (auVar342._8_4_ + auVar339._8_4_) * 1.0000002;
    fVar439 = (auVar342._12_4_ + auVar339._12_4_) * 1.0000002;
    fVar366 = fVar445 - fVar407 * fVar407;
    fVar387 = fVar446 - fVar417 * fVar417;
    fVar391 = fVar452 - fVar422 * fVar422;
    fVar368 = fVar410 - fVar439 * fVar439;
    fVar407 = fVar268 - fVar298 * fVar298;
    fVar417 = fVar324 - fVar327 * fVar327;
    fVar422 = fVar235 - fVar390 * fVar390;
    fVar439 = fVar297 - fVar397 * fVar397;
    fVar381 = fVar381 + fVar381;
    fVar389 = fVar389 + fVar389;
    fVar393 = fVar393 + fVar393;
    fVar396 = fVar396 + fVar396;
    auVar449._0_4_ = fVar381 * fVar381 - fVar407 * 4.0 * fVar366;
    auVar449._4_4_ = fVar389 * fVar389 - fVar417 * 4.0 * fVar387;
    auVar449._8_4_ = fVar393 * fVar393 - fVar422 * 4.0 * fVar391;
    auVar449._12_4_ = fVar396 * fVar396 - fVar439 * 4.0 * fVar368;
    local_4d8._4_4_ = (auVar358._4_4_ - auVar339._4_4_) * 0.99999976;
    local_4d8._0_4_ = (auVar358._0_4_ - auVar339._0_4_) * 0.99999976;
    fStack_4d0 = (auVar358._8_4_ - auVar339._8_4_) * 0.99999976;
    fStack_4cc = (auVar358._12_4_ - auVar339._12_4_) * 0.99999976;
    auVar350._4_4_ = -(uint)(0.0 <= auVar449._4_4_);
    auVar350._0_4_ = -(uint)(0.0 <= auVar449._0_4_);
    auVar350._8_4_ = -(uint)(0.0 <= auVar449._8_4_);
    auVar350._12_4_ = -(uint)(0.0 <= auVar449._12_4_);
    iVar263 = movmskps((int)pSVar118,auVar350);
    uVar134 = (uint)(fVar298 * fVar298) & (uint)DAT_01f46710;
    uVar136 = (uint)(fVar327 * fVar327) & DAT_01f46710._4_4_;
    uVar442 = (uint)(fVar390 * fVar390) & DAT_01f46710._8_4_;
    uVar443 = (uint)(fVar397 * fVar397) & DAT_01f46710._12_4_;
    local_4e8._0_4_ = (uint)fVar407 & (uint)DAT_01f46710;
    local_4e8._4_4_ = (uint)fVar417 & DAT_01f46710._4_4_;
    fStack_4e0 = (float)((uint)fVar422 & DAT_01f46710._8_4_);
    fStack_4dc = (float)((uint)fVar439 & DAT_01f46710._12_4_);
    if (iVar263 == 0) {
      iVar263 = 0;
      auVar343 = _DAT_01f46710;
      auVar359 = _DAT_01f45a30;
      auVar372 = _DAT_01f45a40;
    }
    else {
      auVar251 = sqrtps(auVar403,auVar449);
      bVar129 = 0.0 <= auVar449._0_4_;
      uVar131 = -(uint)bVar129;
      bVar29 = 0.0 <= auVar449._4_4_;
      uVar133 = -(uint)bVar29;
      bVar30 = 0.0 <= auVar449._8_4_;
      uVar135 = -(uint)bVar30;
      bVar31 = 0.0 <= auVar449._12_4_;
      uVar137 = -(uint)bVar31;
      auVar254._0_4_ = fVar407 + fVar407;
      auVar254._4_4_ = fVar417 + fVar417;
      auVar254._8_4_ = fVar422 + fVar422;
      auVar254._12_4_ = fVar439 + fVar439;
      auVar339 = rcpps(_DAT_01f46710,auVar254);
      fVar356 = auVar339._0_4_;
      fVar365 = auVar339._4_4_;
      fVar367 = auVar339._8_4_;
      fVar369 = auVar339._12_4_;
      fVar356 = (1.0 - auVar254._0_4_ * fVar356) * fVar356 + fVar356;
      fVar365 = (1.0 - auVar254._4_4_ * fVar365) * fVar365 + fVar365;
      fVar367 = (1.0 - auVar254._8_4_ * fVar367) * fVar367 + fVar367;
      fVar369 = (1.0 - auVar254._12_4_ * fVar369) * fVar369 + fVar369;
      fVar236 = (-fVar381 - auVar251._0_4_) * fVar356;
      fVar265 = (-fVar389 - auVar251._4_4_) * fVar365;
      fVar266 = (-fVar393 - auVar251._8_4_) * fVar367;
      fVar267 = (-fVar396 - auVar251._12_4_) * fVar369;
      fVar356 = (auVar251._0_4_ - fVar381) * fVar356;
      fVar365 = (auVar251._4_4_ - fVar389) * fVar365;
      fVar367 = (auVar251._8_4_ - fVar393) * fVar367;
      fVar369 = (auVar251._12_4_ - fVar396) * fVar369;
      auVar343._0_4_ = (fVar298 * fVar236 + fVar428) * fVar444;
      auVar343._4_4_ = (fVar327 * fVar265 + fVar433) * fVar453;
      auVar343._8_4_ = (fVar390 * fVar266 + fVar435) * fVar364;
      auVar343._12_4_ = (fVar397 * fVar267 + fVar437) * fVar379;
      local_1f8 = (fVar298 * fVar356 + fVar428) * fVar444;
      fStack_1f4 = (fVar327 * fVar365 + fVar433) * fVar453;
      fStack_1f0 = (fVar390 * fVar367 + fVar435) * fVar364;
      fStack_1ec = (fVar397 * fVar369 + fVar437) * fVar379;
      auVar255._0_4_ = (uint)fVar236 & uVar131;
      auVar255._4_4_ = (uint)fVar265 & uVar133;
      auVar255._8_4_ = (uint)fVar266 & uVar135;
      auVar255._12_4_ = (uint)fVar267 & uVar137;
      auVar359._0_8_ = CONCAT44(~uVar133,~uVar131) & 0x7f8000007f800000;
      auVar359._8_4_ = ~uVar135 & 0x7f800000;
      auVar359._12_4_ = ~uVar137 & 0x7f800000;
      auVar359 = auVar359 | auVar255;
      auVar401._0_4_ = (uint)fVar356 & uVar131;
      auVar401._4_4_ = (uint)fVar365 & uVar133;
      auVar401._8_4_ = (uint)fVar367 & uVar135;
      auVar401._12_4_ = (uint)fVar369 & uVar137;
      auVar372._0_8_ = CONCAT44(~uVar133,~uVar131) & 0xff800000ff800000;
      auVar372._8_4_ = ~uVar135 & 0xff800000;
      auVar372._12_4_ = ~uVar137 & 0xff800000;
      auVar372 = auVar372 | auVar401;
      auVar77._4_4_ = fStack_304;
      auVar77._0_4_ = local_308;
      auVar77._8_4_ = fStack_300;
      auVar77._12_4_ = fStack_2fc;
      auVar32._4_4_ = uVar136;
      auVar32._0_4_ = uVar134;
      auVar32._8_4_ = uVar442;
      auVar32._12_4_ = uVar443;
      auVar339 = maxps(auVar77,auVar32);
      fVar236 = auVar339._0_4_ * 1.9073486e-06;
      fVar265 = auVar339._4_4_ * 1.9073486e-06;
      fVar266 = auVar339._8_4_ * 1.9073486e-06;
      fVar267 = auVar339._12_4_ * 1.9073486e-06;
      auVar402._0_4_ = -(uint)((float)local_4e8._0_4_ < fVar236 && bVar129);
      auVar402._4_4_ = -(uint)((float)local_4e8._4_4_ < fVar265 && bVar29);
      auVar402._8_4_ = -(uint)(fStack_4e0 < fVar266 && bVar30);
      auVar402._12_4_ = -(uint)(fStack_4dc < fVar267 && bVar31);
      iVar263 = movmskps(iVar263,auVar402);
      if (iVar263 != 0) {
        uVar131 = -(uint)(fVar366 <= 0.0);
        uVar133 = -(uint)(fVar387 <= 0.0);
        uVar135 = -(uint)(fVar391 <= 0.0);
        uVar137 = -(uint)(fVar368 <= 0.0);
        auVar262._0_4_ = (uVar131 & 0xff800000 | ~uVar131 & 0x7f800000) & auVar402._0_4_;
        auVar262._4_4_ = (uVar133 & 0xff800000 | ~uVar133 & 0x7f800000) & auVar402._4_4_;
        auVar262._8_4_ = (uVar135 & 0xff800000 | ~uVar135 & 0x7f800000) & auVar402._8_4_;
        auVar262._12_4_ = (uVar137 & 0xff800000 | ~uVar137 & 0x7f800000) & auVar402._12_4_;
        auVar296._0_4_ = ~auVar402._0_4_ & auVar359._0_4_;
        auVar296._4_4_ = ~auVar402._4_4_ & auVar359._4_4_;
        auVar296._8_4_ = ~auVar402._8_4_ & auVar359._8_4_;
        auVar296._12_4_ = ~auVar402._12_4_ & auVar359._12_4_;
        auVar359 = auVar296 | auVar262;
        auVar353._0_4_ = (uVar131 & 0x7f800000 | ~uVar131 & 0xff800000) & auVar402._0_4_;
        auVar353._4_4_ = (uVar133 & 0x7f800000 | ~uVar133 & 0xff800000) & auVar402._4_4_;
        auVar353._8_4_ = (uVar135 & 0x7f800000 | ~uVar135 & 0xff800000) & auVar402._8_4_;
        auVar353._12_4_ = (uVar137 & 0x7f800000 | ~uVar137 & 0xff800000) & auVar402._12_4_;
        auVar404._0_4_ = ~auVar402._0_4_ & auVar372._0_4_;
        auVar404._4_4_ = ~auVar402._4_4_ & auVar372._4_4_;
        auVar404._8_4_ = ~auVar402._8_4_ & auVar372._8_4_;
        auVar404._12_4_ = ~auVar402._12_4_ & auVar372._12_4_;
        auVar372 = auVar404 | auVar353;
        auVar350._4_4_ = -(uint)((fVar265 <= (float)local_4e8._4_4_ || fVar387 <= 0.0) && bVar29);
        auVar350._0_4_ = -(uint)((fVar236 <= (float)local_4e8._0_4_ || fVar366 <= 0.0) && bVar129);
        auVar350._8_4_ = -(uint)((fVar266 <= fStack_4e0 || fVar391 <= 0.0) && bVar30);
        auVar350._12_4_ = -(uint)((fVar267 <= fStack_4dc || fVar368 <= 0.0) && bVar31);
      }
    }
    auVar351._0_4_ = (auVar350._0_4_ << 0x1f) >> 0x1f;
    auVar351._4_4_ = (auVar350._4_4_ << 0x1f) >> 0x1f;
    auVar351._8_4_ = (auVar350._8_4_ << 0x1f) >> 0x1f;
    auVar351._12_4_ = (auVar350._12_4_ << 0x1f) >> 0x1f;
    auVar351 = auVar351 & auVar218;
    iVar263 = movmskps(iVar263,auVar351);
    if (iVar263 != 0) {
      auVar430._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_328._0_4_;
      auVar430._4_4_ = auVar430._0_4_;
      auVar430._8_4_ = auVar430._0_4_;
      auVar430._12_4_ = auVar430._0_4_;
      auVar342 = maxps(auVar430,auVar359);
      auVar334._0_4_ = (ray->super_RayK<1>).tfar - (float)local_328._0_4_;
      auVar334._4_4_ = auVar334._0_4_;
      auVar334._8_4_ = auVar334._0_4_;
      auVar334._12_4_ = auVar334._0_4_;
      auVar251 = minps(auVar334,auVar372);
      auVar161._0_4_ = fVar380 * auVar403._0_4_ + fVar398 * fVar232;
      auVar161._4_4_ = fVar388 * auVar403._4_4_ + fVar406 * fVar232;
      auVar161._8_4_ = fVar392 * auVar403._8_4_ + fVar408 * fVar232;
      auVar161._12_4_ = fVar395 * auVar403._12_4_ + fVar409 * fVar232;
      auVar415._0_4_ = fVar394 * local_338 + auVar161._0_4_;
      auVar415._4_4_ = fVar451 * fStack_334 + auVar161._4_4_;
      auVar415._8_4_ = fVar454 * fStack_330 + auVar161._8_4_;
      auVar415._12_4_ = fVar455 * fStack_32c + auVar161._12_4_;
      auVar339 = rcpps(auVar161,auVar415);
      fVar366 = auVar339._0_4_;
      fVar387 = auVar339._4_4_;
      fVar391 = auVar339._8_4_;
      fVar368 = auVar339._12_4_;
      fVar405 = ((1.0 - auVar415._0_4_ * fVar366) * fVar366 + fVar366) *
                -(fVar429 * fVar394 + fVar413 * fVar380 + fVar405 * fVar398);
      fVar411 = ((1.0 - auVar415._4_4_ * fVar387) * fVar387 + fVar387) *
                -(fVar434 * fVar451 + fVar420 * fVar388 + fVar411 * fVar406);
      fVar418 = ((1.0 - auVar415._8_4_ * fVar391) * fVar391 + fVar391) *
                -(fVar436 * fVar454 + fVar424 * fVar392 + fVar418 * fVar408);
      fVar425 = ((1.0 - auVar415._12_4_ * fVar368) * fVar368 + fVar368) *
                -(fVar438 * fVar455 + fVar427 * fVar395 + fVar425 * fVar409);
      uVar131 = -(uint)(auVar415._0_4_ < 0.0 || ABS(auVar415._0_4_) < 1e-18);
      uVar133 = -(uint)(auVar415._4_4_ < 0.0 || ABS(auVar415._4_4_) < 1e-18);
      uVar135 = -(uint)(auVar415._8_4_ < 0.0 || ABS(auVar415._8_4_) < 1e-18);
      uVar137 = -(uint)(auVar415._12_4_ < 0.0 || ABS(auVar415._12_4_) < 1e-18);
      auVar311._0_8_ = CONCAT44(uVar133,uVar131) & 0xff800000ff800000;
      auVar311._8_4_ = uVar135 & 0xff800000;
      auVar311._12_4_ = uVar137 & 0xff800000;
      auVar162._0_4_ = ~uVar131 & (uint)fVar405;
      auVar162._4_4_ = ~uVar133 & (uint)fVar411;
      auVar162._8_4_ = ~uVar135 & (uint)fVar418;
      auVar162._12_4_ = ~uVar137 & (uint)fVar425;
      auVar342 = maxps(auVar342,auVar162 | auVar311);
      uVar131 = -(uint)(0.0 < auVar415._0_4_ || ABS(auVar415._0_4_) < 1e-18);
      uVar133 = -(uint)(0.0 < auVar415._4_4_ || ABS(auVar415._4_4_) < 1e-18);
      uVar135 = -(uint)(0.0 < auVar415._8_4_ || ABS(auVar415._8_4_) < 1e-18);
      uVar137 = -(uint)(0.0 < auVar415._12_4_ || ABS(auVar415._12_4_) < 1e-18);
      auVar163._0_8_ = CONCAT44(uVar133,uVar131) & 0x7f8000007f800000;
      auVar163._8_4_ = uVar135 & 0x7f800000;
      auVar163._12_4_ = uVar137 & 0x7f800000;
      auVar416._0_4_ = ~uVar131 & (uint)fVar405;
      auVar416._4_4_ = ~uVar133 & (uint)fVar411;
      auVar416._8_4_ = ~uVar135 & (uint)fVar418;
      auVar416._12_4_ = ~uVar137 & (uint)fVar425;
      auVar251 = minps(auVar251,auVar416 | auVar163);
      auVar256._0_4_ = (0.0 - fVar323) * -fVar388 + (0.0 - fVar419) * -fVar406;
      auVar256._4_4_ = (0.0 - fVar326) * -fVar392 + (0.0 - fVar423) * -fVar408;
      auVar256._8_4_ = (0.0 - fVar329) * -fVar395 + (0.0 - fVar426) * -fVar409;
      auVar256._12_4_ = 0x80000000;
      auVar220._0_4_ = -fVar451 * local_338 + -fVar388 * fVar188 + -fVar406 * fVar232;
      auVar220._4_4_ = -fVar454 * fStack_334 + -fVar392 * fVar188 + -fVar408 * fVar232;
      auVar220._8_4_ = -fVar455 * fStack_330 + -fVar395 * fVar188 + -fVar409 * fVar232;
      auVar220._12_4_ = fStack_32c * -0.0 + fVar188 * -0.0 + fVar232 * -0.0;
      auVar339 = rcpps(auVar256,auVar220);
      fVar405 = auVar339._0_4_;
      fVar411 = auVar339._4_4_;
      fVar418 = auVar339._8_4_;
      fVar425 = auVar339._12_4_;
      fVar405 = (((float)DAT_01f46a60 - auVar220._0_4_ * fVar405) * fVar405 + fVar405) *
                -((0.0 - fVar322) * -fVar451 + auVar256._0_4_);
      fVar411 = ((DAT_01f46a60._4_4_ - auVar220._4_4_ * fVar411) * fVar411 + fVar411) *
                -((0.0 - fVar325) * -fVar454 + auVar256._4_4_);
      fVar418 = ((DAT_01f46a60._8_4_ - auVar220._8_4_ * fVar418) * fVar418 + fVar418) *
                -((0.0 - fVar328) * -fVar455 + auVar256._8_4_);
      fVar425 = ((DAT_01f46a60._12_4_ - auVar220._12_4_ * fVar425) * fVar425 + fVar425) * 0.0;
      uVar131 = -(uint)(auVar220._0_4_ < 0.0 || ABS(auVar220._0_4_) < 1e-18);
      uVar133 = -(uint)(auVar220._4_4_ < 0.0 || ABS(auVar220._4_4_) < 1e-18);
      uVar135 = -(uint)(auVar220._8_4_ < 0.0 || ABS(auVar220._8_4_) < 1e-18);
      uVar137 = -(uint)(auVar220._12_4_ < 0.0 || ABS(auVar220._12_4_) < 1e-18);
      auVar257._0_8_ = CONCAT44(uVar133,uVar131) & 0xff800000ff800000;
      auVar257._8_4_ = uVar135 & 0xff800000;
      auVar257._12_4_ = uVar137 & 0xff800000;
      auVar164._0_4_ = ~uVar131 & (uint)fVar405;
      auVar164._4_4_ = ~uVar133 & (uint)fVar411;
      auVar164._8_4_ = ~uVar135 & (uint)fVar418;
      auVar164._12_4_ = ~uVar137 & (uint)fVar425;
      auVar339 = maxps(auVar342,auVar164 | auVar257);
      uVar131 = -(uint)(0.0 < auVar220._0_4_ || ABS(auVar220._0_4_) < 1e-18);
      uVar133 = -(uint)(0.0 < auVar220._4_4_ || ABS(auVar220._4_4_) < 1e-18);
      uVar135 = -(uint)(0.0 < auVar220._8_4_ || ABS(auVar220._8_4_) < 1e-18);
      uVar137 = -(uint)(0.0 < auVar220._12_4_ || ABS(auVar220._12_4_) < 1e-18);
      auVar165._0_8_ = CONCAT44(uVar133,uVar131) & 0x7f8000007f800000;
      auVar165._8_4_ = uVar135 & 0x7f800000;
      auVar165._12_4_ = uVar137 & 0x7f800000;
      auVar221._0_4_ = ~uVar131 & (uint)fVar405;
      auVar221._4_4_ = ~uVar133 & (uint)fVar411;
      auVar221._8_4_ = ~uVar135 & (uint)fVar418;
      auVar221._12_4_ = ~uVar137 & (uint)fVar425;
      aVar335 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar251,auVar221 | auVar165);
      fVar425 = auVar339._12_4_;
      fVar405 = auVar339._0_4_;
      fVar411 = auVar339._4_4_;
      fVar418 = auVar339._8_4_;
      auVar166._0_4_ = -(uint)(fVar405 <= aVar335.v[0]) & auVar351._0_4_;
      auVar166._4_4_ = -(uint)(fVar411 <= aVar335.v[1]) & auVar351._4_4_;
      auVar166._8_4_ = -(uint)(fVar418 <= aVar335.v[2]) & auVar351._8_4_;
      auVar166._12_4_ = -(uint)(fVar425 <= aVar335.v[3]) & auVar351._12_4_;
      iVar263 = movmskps(iVar263,auVar166);
      if (iVar263 != 0) {
        auVar342 = maxps(ZEXT816(0),_local_4d8);
        auVar251 = minps(auVar343,_DAT_01f46a60);
        auVar358 = maxps(auVar251,ZEXT816(0));
        auVar79._4_4_ = fStack_1f4;
        auVar79._0_4_ = local_1f8;
        auVar79._8_4_ = fStack_1f0;
        auVar79._12_4_ = fStack_1ec;
        auVar251 = minps(auVar79,_DAT_01f46a60);
        auVar251 = maxps(auVar251,ZEXT816(0));
        local_108._0_4_ = (auVar358._0_4_ + 0.0) * 0.25 * fVar440 + fVar231;
        local_108._4_4_ = (auVar358._4_4_ + 1.0) * 0.25 * fVar440 + fVar231;
        local_108._8_4_ = (auVar358._8_4_ + 2.0) * 0.25 * fVar440 + fVar231;
        local_108._12_4_ = (auVar358._12_4_ + 3.0) * 0.25 * fVar440 + fVar231;
        local_118[0] = (auVar251._0_4_ + 0.0) * 0.25 * fVar440 + fVar231;
        local_118[1] = (auVar251._4_4_ + 1.0) * 0.25 * fVar440 + fVar231;
        local_118[2] = (auVar251._8_4_ + 2.0) * 0.25 * fVar440 + fVar231;
        local_118[3] = (auVar251._12_4_ + 3.0) * 0.25 * fVar440 + fVar231;
        fVar440 = 0.0;
        fVar366 = 0.0;
        fVar387 = 0.0;
        fVar391 = 0.0;
        auVar258._0_4_ = fVar445 - auVar342._0_4_ * auVar342._0_4_;
        auVar258._4_4_ = fVar446 - auVar342._4_4_ * auVar342._4_4_;
        auVar258._8_4_ = fVar452 - auVar342._8_4_ * auVar342._8_4_;
        auVar258._12_4_ = fVar410 - auVar342._12_4_ * auVar342._12_4_;
        auVar222._0_4_ = fVar381 * fVar381 - fVar407 * 4.0 * auVar258._0_4_;
        auVar222._4_4_ = fVar389 * fVar389 - fVar417 * 4.0 * auVar258._4_4_;
        auVar222._8_4_ = fVar393 * fVar393 - fVar422 * 4.0 * auVar258._8_4_;
        auVar222._12_4_ = fVar396 * fVar396 - fVar439 * 4.0 * auVar258._12_4_;
        auVar289._4_4_ = -(uint)(0.0 <= auVar222._4_4_);
        auVar289._0_4_ = -(uint)(0.0 <= auVar222._0_4_);
        auVar289._8_4_ = -(uint)(0.0 <= auVar222._8_4_);
        auVar289._12_4_ = -(uint)(0.0 <= auVar222._12_4_);
        iVar263 = movmskps(iVar263,auVar289);
        if (iVar263 == 0) {
          fVar298 = 0.0;
          fVar327 = 0.0;
          fVar390 = 0.0;
          fVar397 = 0.0;
          fVar407 = 0.0;
          fVar417 = 0.0;
          fVar422 = 0.0;
          fVar439 = 0.0;
          _local_598 = ZEXT816(0);
          _local_5a8 = ZEXT816(0);
          _local_4d8 = ZEXT816(0);
          iVar263 = 0;
          auVar352 = _DAT_01f45a40;
          auVar360 = _DAT_01f45a30;
        }
        else {
          auVar342 = sqrtps(local_108,auVar222);
          auVar167._0_4_ = fVar407 + fVar407;
          auVar167._4_4_ = fVar417 + fVar417;
          auVar167._8_4_ = fVar422 + fVar422;
          auVar167._12_4_ = fVar439 + fVar439;
          auVar251 = rcpps(auVar258,auVar167);
          fVar446 = auVar251._0_4_;
          fVar454 = auVar251._4_4_;
          fVar452 = auVar251._8_4_;
          fVar455 = auVar251._12_4_;
          fVar446 = ((float)DAT_01f46a60 - auVar167._0_4_ * fVar446) * fVar446 + fVar446;
          fVar454 = (DAT_01f46a60._4_4_ - auVar167._4_4_ * fVar454) * fVar454 + fVar454;
          fVar452 = (DAT_01f46a60._8_4_ - auVar167._8_4_ * fVar452) * fVar452 + fVar452;
          fVar455 = (DAT_01f46a60._12_4_ - auVar167._12_4_ * fVar455) * fVar455 + fVar455;
          fVar368 = (-fVar381 - auVar342._0_4_) * fVar446;
          fVar394 = (-fVar389 - auVar342._4_4_) * fVar454;
          fVar445 = (-fVar393 - auVar342._8_4_) * fVar452;
          fVar451 = (-fVar396 - auVar342._12_4_) * fVar455;
          fVar446 = (auVar342._0_4_ - fVar381) * fVar446;
          fVar454 = (auVar342._4_4_ - fVar389) * fVar454;
          fVar452 = (auVar342._8_4_ - fVar393) * fVar452;
          fVar455 = (auVar342._12_4_ - fVar396) * fVar455;
          fVar407 = (fVar298 * fVar368 + fVar428) * fVar444;
          fVar417 = (fVar327 * fVar394 + fVar433) * fVar453;
          fVar422 = (fVar390 * fVar445 + fVar435) * fVar364;
          fVar439 = (fVar397 * fVar451 + fVar437) * fVar379;
          local_598._4_4_ = fStack_334 * fVar394 - (fVar450 * fVar417 + fVar322);
          local_598._0_4_ = local_338 * fVar368 - (fVar441 * fVar407 + fVar299);
          fStack_590 = fStack_330 * fVar445 - (fVar376 * fVar422 + fVar325);
          fStack_58c = fStack_32c * fVar451 - (fVar377 * fVar439 + fVar328);
          local_5a8._4_4_ = fVar188 * fVar394 - ((float)local_348._4_4_ * fVar417 + fVar323);
          local_5a8._0_4_ = fVar188 * fVar368 - ((float)local_348._0_4_ * fVar407 + fVar300);
          fStack_5a0 = fVar188 * fVar445 - (fStack_340 * fVar422 + fVar326);
          fStack_59c = fVar188 * fVar451 - (fStack_33c * fVar439 + fVar329);
          local_4d8._4_4_ = fVar232 * fVar394 - (fVar417 * fStack_354 + fVar419);
          local_4d8._0_4_ = fVar232 * fVar368 - (fVar407 * local_358 + fVar412);
          fStack_4d0 = fVar232 * fVar445 - (fVar422 * fStack_350 + fVar423);
          fStack_4cc = fVar232 * fVar451 - (fVar439 * fStack_34c + fVar426);
          fVar444 = (fVar298 * fVar446 + fVar428) * fVar444;
          fVar453 = (fVar327 * fVar454 + fVar433) * fVar453;
          fVar364 = (fVar390 * fVar452 + fVar435) * fVar364;
          fVar379 = (fVar397 * fVar455 + fVar437) * fVar379;
          fVar440 = local_338 * fVar446 - (fVar441 * fVar444 + fVar299);
          fVar366 = fStack_334 * fVar454 - (fVar450 * fVar453 + fVar322);
          fVar387 = fStack_330 * fVar452 - (fVar376 * fVar364 + fVar325);
          fVar391 = fStack_32c * fVar455 - (fVar377 * fVar379 + fVar328);
          fVar298 = fVar188 * fVar446 - ((float)local_348._0_4_ * fVar444 + fVar300);
          fVar327 = fVar188 * fVar454 - ((float)local_348._4_4_ * fVar453 + fVar323);
          fVar390 = fVar188 * fVar452 - (fStack_340 * fVar364 + fVar326);
          fVar397 = fVar188 * fVar455 - (fStack_33c * fVar379 + fVar329);
          bVar129 = 0.0 <= auVar222._0_4_;
          uVar131 = -(uint)bVar129;
          bVar29 = 0.0 <= auVar222._4_4_;
          uVar133 = -(uint)bVar29;
          bVar30 = 0.0 <= auVar222._8_4_;
          uVar135 = -(uint)bVar30;
          bVar31 = 0.0 <= auVar222._12_4_;
          uVar137 = -(uint)bVar31;
          fVar407 = fVar232 * fVar446 - (fVar444 * local_358 + fVar412);
          fVar417 = fVar232 * fVar454 - (fVar453 * fStack_354 + fVar419);
          fVar422 = fVar232 * fVar452 - (fVar364 * fStack_350 + fVar423);
          fVar439 = fVar232 * fVar455 - (fVar379 * fStack_34c + fVar426);
          auVar168._0_4_ = (uint)fVar368 & uVar131;
          auVar168._4_4_ = (uint)fVar394 & uVar133;
          auVar168._8_4_ = (uint)fVar445 & uVar135;
          auVar168._12_4_ = (uint)fVar451 & uVar137;
          auVar360._0_8_ = CONCAT44(~uVar133,~uVar131) & 0x7f8000007f800000;
          auVar360._8_4_ = ~uVar135 & 0x7f800000;
          auVar360._12_4_ = ~uVar137 & 0x7f800000;
          auVar360 = auVar360 | auVar168;
          auVar344._0_4_ = (uint)fVar446 & uVar131;
          auVar344._4_4_ = (uint)fVar454 & uVar133;
          auVar344._8_4_ = (uint)fVar452 & uVar135;
          auVar344._12_4_ = (uint)fVar455 & uVar137;
          auVar352._0_8_ = CONCAT44(~uVar133,~uVar131) & 0xff800000ff800000;
          auVar352._8_4_ = ~uVar135 & 0xff800000;
          auVar352._12_4_ = ~uVar137 & 0xff800000;
          auVar352 = auVar352 | auVar344;
          auVar78._4_4_ = fStack_304;
          auVar78._0_4_ = local_308;
          auVar78._8_4_ = fStack_300;
          auVar78._12_4_ = fStack_2fc;
          auVar80._4_4_ = uVar136;
          auVar80._0_4_ = uVar134;
          auVar80._8_4_ = uVar442;
          auVar80._12_4_ = uVar443;
          auVar251 = maxps(auVar78,auVar80);
          fVar441 = auVar251._0_4_ * 1.9073486e-06;
          fVar444 = auVar251._4_4_ * 1.9073486e-06;
          fVar450 = auVar251._8_4_ * 1.9073486e-06;
          fVar453 = auVar251._12_4_ * 1.9073486e-06;
          auVar345._0_4_ = -(uint)((float)local_4e8._0_4_ < fVar441 && bVar129);
          auVar345._4_4_ = -(uint)((float)local_4e8._4_4_ < fVar444 && bVar29);
          auVar345._8_4_ = -(uint)(fStack_4e0 < fVar450 && bVar30);
          auVar345._12_4_ = -(uint)(fStack_4dc < fVar453 && bVar31);
          iVar263 = movmskps(iVar263,auVar345);
          if (iVar263 != 0) {
            uVar134 = -(uint)(auVar258._0_4_ <= 0.0);
            uVar136 = -(uint)(auVar258._4_4_ <= 0.0);
            uVar442 = -(uint)(auVar258._8_4_ <= 0.0);
            uVar443 = -(uint)(auVar258._12_4_ <= 0.0);
            auVar373._0_4_ = (uVar134 & 0xff800000 | ~uVar134 & 0x7f800000) & auVar345._0_4_;
            auVar373._4_4_ = (uVar136 & 0xff800000 | ~uVar136 & 0x7f800000) & auVar345._4_4_;
            auVar373._8_4_ = (uVar442 & 0xff800000 | ~uVar442 & 0x7f800000) & auVar345._8_4_;
            auVar373._12_4_ = (uVar443 & 0xff800000 | ~uVar443 & 0x7f800000) & auVar345._12_4_;
            auVar385._0_4_ = ~auVar345._0_4_ & auVar360._0_4_;
            auVar385._4_4_ = ~auVar345._4_4_ & auVar360._4_4_;
            auVar385._8_4_ = ~auVar345._8_4_ & auVar360._8_4_;
            auVar385._12_4_ = ~auVar345._12_4_ & auVar360._12_4_;
            auVar362._0_4_ = (uVar134 & 0x7f800000 | ~uVar134 & 0xff800000) & auVar345._0_4_;
            auVar362._4_4_ = (uVar136 & 0x7f800000 | ~uVar136 & 0xff800000) & auVar345._4_4_;
            auVar362._8_4_ = (uVar442 & 0x7f800000 | ~uVar442 & 0xff800000) & auVar345._8_4_;
            auVar362._12_4_ = (uVar443 & 0x7f800000 | ~uVar443 & 0xff800000) & auVar345._12_4_;
            auVar346._0_4_ = ~auVar345._0_4_ & auVar352._0_4_;
            auVar346._4_4_ = ~auVar345._4_4_ & auVar352._4_4_;
            auVar346._8_4_ = ~auVar345._8_4_ & auVar352._8_4_;
            auVar346._12_4_ = ~auVar345._12_4_ & auVar352._12_4_;
            auVar289._4_4_ =
                 -(uint)((fVar444 <= (float)local_4e8._4_4_ || auVar258._4_4_ <= 0.0) && bVar29);
            auVar289._0_4_ =
                 -(uint)((fVar441 <= (float)local_4e8._0_4_ || auVar258._0_4_ <= 0.0) && bVar129);
            auVar289._8_4_ = -(uint)((fVar450 <= fStack_4e0 || auVar258._8_4_ <= 0.0) && bVar30);
            auVar289._12_4_ = -(uint)((fVar453 <= fStack_4dc || auVar258._12_4_ <= 0.0) && bVar31);
            auVar352 = auVar346 | auVar362;
            auVar360 = auVar385 | auVar373;
          }
        }
        fVar441 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar444 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar450 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar251 = minps((undefined1  [16])aVar335,auVar360);
        aVar361 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar339,auVar352);
        tp1.lower.field_0 = aVar361;
        tp1.upper.field_0 = aVar335;
        auVar312._0_4_ = -(uint)(fVar405 <= auVar251._0_4_) & auVar166._0_4_;
        auVar312._4_4_ = -(uint)(fVar411 <= auVar251._4_4_) & auVar166._4_4_;
        auVar312._8_4_ = -(uint)(fVar418 <= auVar251._8_4_) & auVar166._8_4_;
        auVar312._12_4_ = -(uint)(fVar425 <= auVar251._12_4_) & auVar166._12_4_;
        local_348 = (undefined1  [8])
                    CONCAT44(-(uint)(aVar361.v[1] <= aVar335.v[1]) & auVar166._4_4_,
                             -(uint)(aVar361.v[0] <= aVar335.v[0]) & auVar166._0_4_);
        fStack_340 = (float)(-(uint)(aVar361.v[2] <= aVar335.v[2]) & auVar166._8_4_);
        fStack_33c = (float)(-(uint)(aVar361.v[3] <= aVar335.v[3]) & auVar166._12_4_);
        auVar169._8_4_ = fStack_340;
        auVar169._0_8_ = local_348;
        auVar169._12_4_ = fStack_33c;
        iVar263 = movmskps(iVar263,auVar169 | auVar312);
        pRVar119 = (RTCRayN *)CONCAT44((int)((ulong)pSVar118 >> 0x20),iVar263);
        if (iVar263 != 0) {
          local_4e8._4_4_ =
               -(uint)(0.3 <= ABS(fVar366 * fVar441 + fVar327 * fVar444 + fVar417 * fVar450)) &
               auVar289._4_4_;
          local_4e8._0_4_ =
               -(uint)(0.3 <= ABS(fVar440 * fVar441 + fVar298 * fVar444 + fVar407 * fVar450)) &
               auVar289._0_4_;
          fStack_4e0 = (float)(-(uint)(0.3 <= ABS(fVar387 * fVar441 +
                                                  fVar390 * fVar444 + fVar422 * fVar450)) &
                              auVar289._8_4_);
          fStack_4dc = (float)(-(uint)(0.3 <= ABS(fVar391 * fVar441 +
                                                  fVar397 * fVar444 + fVar439 * fVar450)) &
                              auVar289._12_4_);
          local_358 = local_60c;
          fStack_354 = local_60c;
          fStack_350 = local_60c;
          fStack_34c = local_60c;
          local_4d8._0_4_ =
               -(uint)((int)local_60c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4d8._0_4_ * fVar450 +
                                                 (float)local_5a8._0_4_ * fVar444 +
                                                 (float)local_598._0_4_ * fVar441)) & auVar289._0_4_
                             ) << 0x1f) >> 0x1f) + 4);
          local_4d8._4_4_ =
               -(uint)((int)local_60c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4d8._4_4_ * fVar450 +
                                                 (float)local_5a8._4_4_ * fVar444 +
                                                 (float)local_598._4_4_ * fVar441)) & auVar289._4_4_
                             ) << 0x1f) >> 0x1f) + 4);
          fStack_4d0 = (float)-(uint)((int)local_60c <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4d0 * fVar450 +
                                                                fStack_5a0 * fVar444 +
                                                                fStack_590 * fVar441)) &
                                            auVar289._8_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4cc = (float)-(uint)((int)local_60c <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4cc * fVar450 +
                                                                fStack_59c * fVar444 +
                                                                fStack_58c * fVar441)) &
                                            auVar289._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar170 = ~_local_4d8 & auVar312;
          while( true ) {
            vVar115.field_0 = tp1.lower.field_0;
            local_258 = auVar170;
            uVar121 = (undefined4)((ulong)pRVar119 >> 0x20);
            iVar263 = movmskps((int)pRVar119,auVar170);
            pRVar119 = (RTCRayN *)CONCAT44(uVar121,iVar263);
            if (iVar263 == 0) break;
            uVar134 = auVar170._0_4_;
            uVar136 = auVar170._4_4_;
            uVar442 = auVar170._8_4_;
            uVar443 = auVar170._12_4_;
            auVar223._0_4_ = uVar134 & (uint)fVar405;
            auVar223._4_4_ = uVar136 & (uint)fVar411;
            auVar223._8_4_ = uVar442 & (uint)fVar418;
            auVar223._12_4_ = uVar443 & (uint)fVar425;
            auVar259._0_8_ = CONCAT44(~uVar136,~uVar134) & 0x7f8000007f800000;
            auVar259._8_4_ = ~uVar442 & 0x7f800000;
            auVar259._12_4_ = ~uVar443 & 0x7f800000;
            auVar259 = auVar259 | auVar223;
            auVar290._4_4_ = auVar259._0_4_;
            auVar290._0_4_ = auVar259._4_4_;
            auVar290._8_4_ = auVar259._12_4_;
            auVar290._12_4_ = auVar259._8_4_;
            auVar339 = minps(auVar290,auVar259);
            auVar224._0_8_ = auVar339._8_8_;
            auVar224._8_4_ = auVar339._0_4_;
            auVar224._12_4_ = auVar339._4_4_;
            auVar339 = minps(auVar224,auVar339);
            auVar225._0_8_ =
                 CONCAT44(-(uint)(auVar339._4_4_ == auVar259._4_4_) & uVar136,
                          -(uint)(auVar339._0_4_ == auVar259._0_4_) & uVar134);
            auVar225._8_4_ = -(uint)(auVar339._8_4_ == auVar259._8_4_) & uVar442;
            auVar225._12_4_ = -(uint)(auVar339._12_4_ == auVar259._12_4_) & uVar443;
            iVar263 = movmskps(iVar263,auVar225);
            if (iVar263 != 0) {
              auVar170._8_4_ = auVar225._8_4_;
              auVar170._0_8_ = auVar225._0_8_;
              auVar170._12_4_ = auVar225._12_4_;
            }
            uVar116 = movmskps(iVar263,auVar170);
            uVar120 = CONCAT44(uVar121,uVar116);
            pRVar119 = (RTCRayN *)0x0;
            if (uVar120 != 0) {
              for (; (uVar120 >> (long)pRVar119 & 1) == 0; pRVar119 = pRVar119 + 1) {
              }
            }
            *(undefined4 *)(local_258 + (long)pRVar119 * 4) = 0;
            fVar298 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar327 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar390 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar397 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar75._4_4_ = fVar355;
            auVar75._0_4_ = fVar354;
            auVar75._8_4_ = fVar363;
            auVar75._12_4_ = fVar370;
            auVar251 = minps(_local_4c8,auVar75);
            auVar342 = maxps(_local_4c8,auVar75);
            auVar73._4_4_ = fVar375;
            auVar73._0_4_ = fVar374;
            auVar73._8_4_ = fVar378;
            auVar73._12_4_ = fVar386;
            auVar339 = minps(auVar73,_local_578);
            auVar251 = minps(auVar251,auVar339);
            auVar339 = maxps(auVar73,_local_578);
            auVar342 = maxps(auVar342,auVar339);
            auVar313._0_8_ = auVar251._0_8_ & 0x7fffffff7fffffff;
            auVar313._8_4_ = auVar251._8_4_ & 0x7fffffff;
            auVar313._12_4_ = auVar251._12_4_ & 0x7fffffff;
            auVar171._0_8_ = auVar342._0_8_ & 0x7fffffff7fffffff;
            auVar171._8_4_ = auVar342._8_4_ & 0x7fffffff;
            auVar171._12_4_ = ABS(auVar342._12_4_);
            auVar339 = maxps(auVar313,auVar171);
            fVar407 = auVar339._4_4_;
            if (auVar339._4_4_ <= auVar339._0_4_) {
              fVar407 = auVar339._0_4_;
            }
            auVar314._8_8_ = auVar339._8_8_;
            auVar314._0_8_ = auVar339._8_8_;
            if (auVar339._8_4_ <= fVar407) {
              auVar314._0_4_ = fVar407;
            }
            fVar422 = auVar314._0_4_ * 1.9073486e-06;
            fVar407 = *(float *)(local_108 + (long)pRVar119 * 4);
            fVar417 = local_118[(long)(pRVar119 + -8)];
            lVar127 = 5;
            do {
              bVar129 = lVar127 == 0;
              lVar127 = lVar127 + -1;
              if (bVar129) goto LAB_003b8039;
              fVar440 = SQRT(fVar390 * fVar390 + fVar327 * fVar327 + fVar298 * fVar298) *
                        1.9073486e-06 * fVar417;
              fVar444 = 1.0 - fVar407;
              fVar450 = fVar407 * 3.0;
              fVar439 = -fVar407 * fVar444 * fVar444 * 0.5;
              fVar300 = (fVar407 * fVar407 * (fVar450 + -5.0) + 2.0) * 0.5;
              fVar299 = ((fVar444 * 3.0 + -5.0) * fVar444 * fVar444 + 2.0) * 0.5;
              fVar366 = -fVar444 * fVar407 * fVar407 * 0.5;
              fVar441 = fVar439 * fStack_4bc +
                        fVar300 * fVar370 + fVar299 * fVar386 + fVar366 * fStack_56c;
              fVar364 = (fVar407 * (fVar444 + fVar444) - fVar444 * fVar444) * 0.5;
              fVar376 = ((fVar407 + fVar407) * (fVar450 + -5.0) + fVar407 * fVar450) * 0.5;
              fVar453 = ((fVar450 + 2.0) * (fVar444 + fVar444) + fVar444 * -3.0 * fVar444) * 0.5;
              fVar444 = (fVar444 * -2.0 * fVar407 + fVar407 * fVar407) * 0.5;
              fVar322 = fVar364 * (float)local_4c8._0_4_ +
                        fVar376 * fVar354 + fVar453 * fVar374 + fVar444 * (float)local_578._0_4_;
              fVar323 = fVar364 * (float)local_4c8._4_4_ +
                        fVar376 * fVar355 + fVar453 * fVar375 + fVar444 * fVar421;
              fVar387 = fVar364 * fStack_4c0 +
                        fVar376 * fVar363 + fVar453 * fVar378 + fVar444 * fStack_570;
              fVar325 = fVar364 * fStack_4bc +
                        fVar376 * fVar370 + fVar453 * fVar386 + fVar444 * fStack_56c;
              fVar453 = fVar407 * -3.0 + 2.0;
              fVar377 = fVar407 * 9.0 + -5.0;
              fVar444 = fVar407 * -9.0 + 4.0;
              fVar450 = fVar450 + -1.0;
              fVar376 = fVar453 * (float)local_4c8._0_4_ +
                        fVar377 * fVar354 + fVar444 * fVar374 + fVar450 * (float)local_578._0_4_;
              fVar364 = fVar453 * (float)local_4c8._4_4_ +
                        fVar377 * fVar355 + fVar444 * fVar375 + fVar450 * fVar421;
              fVar453 = fVar453 * fStack_4c0 +
                        fVar377 * fVar363 + fVar444 * fVar378 + fVar450 * fStack_570;
              fVar377 = (fVar417 * fVar298 + 0.0) -
                        (fVar439 * (float)local_4c8._0_4_ +
                        fVar300 * fVar354 + fVar299 * fVar374 + fVar366 * (float)local_578._0_4_);
              fVar379 = (fVar417 * fVar327 + 0.0) -
                        (fVar439 * (float)local_4c8._4_4_ +
                        fVar300 * fVar355 + fVar299 * fVar375 + fVar366 * fVar421);
              fVar299 = (fVar417 * fVar390 + 0.0) -
                        (fVar439 * fStack_4c0 +
                        fVar300 * fVar363 + fVar299 * fVar378 + fVar366 * fStack_570);
              fVar300 = (fVar417 * fVar397 + 0.0) - fVar441;
              fVar439 = fVar379 * fVar379;
              fVar444 = fVar299 * fVar299;
              fVar450 = fVar300 * fVar300;
              auVar383._0_4_ = fVar439 + fVar377 * fVar377 + fVar444;
              auVar383._4_4_ = fVar439 + fVar439 + fVar450;
              auVar383._8_4_ = fVar439 + fVar444 + fVar444;
              auVar383._12_4_ = fVar439 + fVar450 + fVar450;
              fVar439 = fVar422;
              if (fVar422 <= fVar440) {
                fVar439 = fVar440;
              }
              fVar444 = fVar323 * fVar323 + fVar322 * fVar322 + fVar387 * fVar387;
              auVar251 = ZEXT416((uint)fVar444);
              auVar339 = rsqrtss(ZEXT416((uint)fVar444),auVar251);
              fVar440 = auVar339._0_4_;
              fVar450 = fVar440 * 1.5 - fVar440 * fVar440 * fVar444 * 0.5 * fVar440;
              fVar329 = fVar322 * fVar450;
              fVar368 = fVar323 * fVar450;
              fVar394 = fVar387 * fVar450;
              fVar445 = fVar325 * fVar450;
              fVar328 = fVar453 * fVar387 + fVar364 * fVar323 + fVar376 * fVar322;
              auVar339 = rcpss(auVar251,auVar251);
              fVar440 = (2.0 - fVar444 * auVar339._0_4_) * auVar339._0_4_;
              fVar366 = fVar379 * fVar368;
              fVar326 = fVar299 * fVar394;
              fVar391 = fVar300 * fVar445;
              fVar451 = fVar366 + fVar377 * fVar329 + fVar326;
              fVar446 = fVar366 + fVar366 + fVar391;
              fVar326 = fVar366 + fVar326 + fVar326;
              fVar391 = fVar366 + fVar391 + fVar391;
              fVar454 = (SQRT(auVar383._0_4_) + 1.0) * (fVar422 / SQRT(fVar444)) +
                        SQRT(auVar383._0_4_) * fVar422 + fVar439;
              fVar366 = fVar445 * -fVar325;
              fVar450 = fVar394 * -fVar387 + fVar368 * -fVar323 + fVar329 * -fVar322 +
                        fVar440 * (fVar444 * fVar453 - fVar328 * fVar387) * fVar450 * fVar299 +
                        fVar440 * (fVar444 * fVar364 - fVar328 * fVar323) * fVar450 * fVar379 +
                        fVar440 * (fVar444 * fVar376 - fVar328 * fVar322) * fVar450 * fVar377;
              fVar376 = fVar390 * fVar394 + fVar327 * fVar368 + fVar298 * fVar329;
              fVar440 = auVar383._0_4_ - fVar451 * fVar451;
              auVar172._0_8_ = CONCAT44(auVar383._4_4_ - fVar446 * fVar446,fVar440);
              auVar172._8_4_ = auVar383._8_4_ - fVar326 * fVar326;
              auVar172._12_4_ = auVar383._12_4_ - fVar391 * fVar391;
              fVar453 = -fVar325 * fVar300;
              local_528 = CONCAT44(fVar366,fVar450);
              auVar226._8_4_ = auVar172._8_4_;
              auVar226._0_8_ = auVar172._0_8_;
              auVar226._12_4_ = auVar172._12_4_;
              auVar339 = rsqrtss(auVar226,auVar172);
              fVar444 = auVar339._0_4_;
              fVar444 = fVar444 * 1.5 - fVar444 * fVar444 * fVar440 * 0.5 * fVar444;
              if (fVar440 < 0.0) {
                fVar440 = sqrtf(fVar440);
                pRVar119 = extraout_RAX;
                pRVar124 = extraout_RDX;
              }
              else {
                fVar440 = SQRT(fVar440);
              }
              fVar440 = fVar440 - fVar441;
              fVar441 = ((-fVar387 * fVar299 + -fVar323 * fVar379 + -fVar322 * fVar377) -
                        fVar451 * fVar450) * fVar444 - fVar325;
              fVar444 = ((fVar390 * fVar299 + fVar327 * fVar379 + fVar298 * fVar377) -
                        fVar451 * fVar376) * fVar444;
              auVar291._0_4_ = fVar450 * fVar444 - fVar376 * fVar441;
              auVar316._8_4_ = -fVar453;
              auVar316._0_8_ = CONCAT44(fVar453,fVar441) ^ 0x8000000000000000;
              auVar316._12_4_ = fVar397 * fVar300;
              auVar315._8_8_ = auVar316._8_8_;
              auVar315._0_8_ = CONCAT44(fVar444,fVar441) ^ 0x80000000;
              auVar291._4_4_ = auVar291._0_4_;
              auVar291._8_4_ = auVar291._0_4_;
              auVar291._12_4_ = auVar291._0_4_;
              auVar339 = divps(auVar315,auVar291);
              auVar337._8_4_ = fVar366;
              auVar337._0_8_ = local_528;
              auVar337._12_4_ = -(fVar397 * fVar445);
              auVar336._8_8_ = auVar337._8_8_;
              auVar336._0_8_ = CONCAT44(fVar376,fVar450) ^ 0x8000000000000000;
              auVar251 = divps(auVar336,auVar291);
              fVar417 = fVar417 - (fVar440 * auVar251._0_4_ + fVar451 * auVar339._0_4_);
              fVar407 = fVar407 - (fVar440 * auVar251._4_4_ + fVar451 * auVar339._4_4_);
            } while ((fVar454 <= ABS(fVar451)) ||
                    (auVar342._12_4_ * 1.9073486e-06 + fVar439 + fVar454 <= ABS(fVar440)));
            fVar417 = local_328._0_4_ + fVar417;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar417) &&
               (((fVar298 = (ray->super_RayK<1>).tfar, fVar417 <= fVar298 && (0.0 <= fVar407)) &&
                (fVar407 <= 1.0)))) {
              auVar339 = rsqrtss(auVar383,auVar383);
              fVar327 = auVar339._0_4_;
              pGVar26 = (context->scene->geometries).items[uVar130].ptr;
              uVar134 = (ray->super_RayK<1>).mask;
              pRVar119 = (RTCRayN *)(ulong)uVar134;
              if ((pGVar26->mask & uVar134) != 0) {
                fVar327 = fVar327 * 1.5 + fVar327 * fVar327 * auVar383._0_4_ * -0.5 * fVar327;
                fVar377 = fVar377 * fVar327;
                fVar379 = fVar379 * fVar327;
                fVar299 = fVar299 * fVar327;
                fVar327 = fVar325 * fVar377 + fVar322;
                fVar390 = fVar325 * fVar379 + fVar323;
                fVar397 = fVar325 * fVar299 + fVar387;
                fVar439 = fVar379 * fVar322 - fVar323 * fVar377;
                fVar440 = fVar299 * fVar323 - fVar387 * fVar379;
                fVar441 = fVar377 * fVar387 - fVar322 * fVar299;
                fVar422 = fVar390 * fVar440 - fVar441 * fVar327;
                uVar189 = CONCAT44(fVar327 * fVar439 - fVar440 * fVar397,
                                   fVar397 * fVar441 - fVar439 * fVar390);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar417;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar189;
                  (ray->Ng).field_0.field_0.z = fVar422;
                  ray->u = fVar407;
                  ray->v = 0.0;
                  ray->primID = uVar132;
                  ray->geomID = uVar130;
                  ray->instID[0] = context->user->instID[0];
                  uVar134 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar134;
                  pRVar119 = (RTCRayN *)(ulong)uVar134;
                }
                else {
                  vu0.field_0._0_8_ = uVar189;
                  vu0.field_0.v[2] = fVar422;
                  vu0.field_0.v[3] = fVar407;
                  pRVar122 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  (ray->super_RayK<1>).tfar = fVar417;
                  local_368._0_4_ = 0xffffffff;
                  args.geometryUserPtr = pGVar26->userPtr;
                  args.valid = (int *)local_368;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_003b8159:
                    pRVar122 = context->args;
                    if ((pRVar122->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar122->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar122->filter)(&args);
                      pRVar124 = extraout_RDX_01;
                      if (*args.valid == 0) goto LAB_003b81f0;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pRVar124 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar122 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar119 = args.ray;
                  }
                  else {
                    (*pGVar26->intersectionFilterN)(&args);
                    pRVar124 = extraout_RDX_00;
                    if (*args.valid != 0) goto LAB_003b8159;
LAB_003b81f0:
                    (ray->super_RayK<1>).tfar = fVar298;
                    pRVar119 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_003b8039:
            fVar298 = (ray->super_RayK<1>).tfar;
            auVar170._0_4_ = -(uint)(fVar338 + fVar405 <= fVar298) & local_258._0_4_;
            auVar170._4_4_ = -(uint)(fVar338 + fVar411 <= fVar298) & local_258._4_4_;
            auVar170._8_4_ = -(uint)(fVar338 + fVar418 <= fVar298) & local_258._8_4_;
            auVar170._12_4_ = -(uint)(fVar338 + fVar425 <= fVar298) & local_258._12_4_;
          }
          fVar298 = (ray->super_RayK<1>).tfar;
          auVar292._0_4_ = -(uint)(aVar361.v[0] + fVar338 <= fVar298) & local_348._0_4_;
          auVar292._4_4_ = -(uint)(aVar361.v[1] + fVar338 <= fVar298) & local_348._4_4_;
          auVar292._8_4_ = -(uint)(aVar361.v[2] + fVar338 <= fVar298) & (uint)fStack_340;
          auVar292._12_4_ = -(uint)(aVar361.v[3] + fVar338 <= fVar298) & (uint)fStack_33c;
          local_4e8._0_4_ = -(uint)((int)local_358 < ((int)(local_4e8._0_4_ << 0x1f) >> 0x1f) + 4);
          local_4e8._4_4_ = -(uint)((int)fStack_354 < ((int)(local_4e8._4_4_ << 0x1f) >> 0x1f) + 4);
          fStack_4e0 = (float)-(uint)((int)fStack_350 < (((int)fStack_4e0 << 0x1f) >> 0x1f) + 4);
          fStack_4dc = (float)-(uint)((int)fStack_34c < (((int)fStack_4dc << 0x1f) >> 0x1f) + 4);
          auVar227 = ~_local_4e8 & auVar292;
          fVar327 = fVar338 + tp1.lower.field_0.v[0];
          fVar390 = fVar338 + tp1.lower.field_0.v[1];
          fVar397 = fVar338 + tp1.lower.field_0.v[2];
          fVar407 = fVar338 + tp1.lower.field_0.v[3];
          while( true ) {
            local_368 = auVar227;
            iVar263 = movmskps((int)pRVar119,auVar227);
            if (iVar263 == 0) break;
            auVar251 = ~auVar227 & _DAT_01f45a30 | auVar227 & (undefined1  [16])vVar115.field_0;
            auVar293._4_4_ = auVar251._0_4_;
            auVar293._0_4_ = auVar251._4_4_;
            auVar293._8_4_ = auVar251._12_4_;
            auVar293._12_4_ = auVar251._8_4_;
            auVar339 = minps(auVar293,auVar251);
            auVar173._0_8_ = auVar339._8_8_;
            auVar173._8_4_ = auVar339._0_4_;
            auVar173._12_4_ = auVar339._4_4_;
            auVar339 = minps(auVar173,auVar339);
            auVar174._0_8_ =
                 CONCAT44(-(uint)(auVar339._4_4_ == auVar251._4_4_) & auVar227._4_4_,
                          -(uint)(auVar339._0_4_ == auVar251._0_4_) & auVar227._0_4_);
            auVar174._8_4_ = -(uint)(auVar339._8_4_ == auVar251._8_4_) & auVar227._8_4_;
            auVar174._12_4_ = -(uint)(auVar339._12_4_ == auVar251._12_4_) & auVar227._12_4_;
            iVar263 = movmskps(iVar263,auVar174);
            if (iVar263 != 0) {
              auVar227._8_4_ = auVar174._8_4_;
              auVar227._0_8_ = auVar174._0_8_;
              auVar227._12_4_ = auVar174._12_4_;
            }
            uVar121 = movmskps(iVar263,auVar227);
            uVar120 = CONCAT44((int)((ulong)pRVar119 >> 0x20),uVar121);
            pRVar119 = (RTCRayN *)0x0;
            if (uVar120 != 0) {
              for (; (uVar120 >> (long)pRVar119 & 1) == 0; pRVar119 = pRVar119 + 1) {
              }
            }
            *(undefined4 *)(local_368 + (long)pRVar119 * 4) = 0;
            fVar298 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar417 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar422 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar439 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar76._4_4_ = fVar355;
            auVar76._0_4_ = fVar354;
            auVar76._8_4_ = fVar363;
            auVar76._12_4_ = fVar370;
            auVar251 = minps(_local_4c8,auVar76);
            auVar342 = maxps(_local_4c8,auVar76);
            auVar74._4_4_ = fVar375;
            auVar74._0_4_ = fVar374;
            auVar74._8_4_ = fVar378;
            auVar74._12_4_ = fVar386;
            auVar339 = minps(auVar74,_local_578);
            auVar251 = minps(auVar251,auVar339);
            auVar339 = maxps(auVar74,_local_578);
            auVar342 = maxps(auVar342,auVar339);
            auVar317._0_8_ = auVar251._0_8_ & 0x7fffffff7fffffff;
            auVar317._8_4_ = auVar251._8_4_ & 0x7fffffff;
            auVar317._12_4_ = auVar251._12_4_ & 0x7fffffff;
            auVar175._0_8_ = auVar342._0_8_ & 0x7fffffff7fffffff;
            auVar175._8_4_ = auVar342._8_4_ & 0x7fffffff;
            auVar175._12_4_ = ABS(auVar342._12_4_);
            auVar339 = maxps(auVar317,auVar175);
            fVar440 = auVar339._4_4_;
            if (auVar339._4_4_ <= auVar339._0_4_) {
              fVar440 = auVar339._0_4_;
            }
            auVar318._8_8_ = auVar339._8_8_;
            auVar318._0_8_ = auVar339._8_8_;
            if (auVar339._8_4_ <= fVar440) {
              auVar318._0_4_ = fVar440;
            }
            fVar444 = auVar318._0_4_ * 1.9073486e-06;
            fVar440 = local_118[(long)pRVar119];
            fVar441 = tp1.upper.field_0.v[(long)pRVar119];
            lVar127 = 5;
            do {
              bVar129 = lVar127 == 0;
              lVar127 = lVar127 + -1;
              if (bVar129) goto LAB_003b8ada;
              fVar453 = SQRT(fVar422 * fVar422 + fVar417 * fVar417 + fVar298 * fVar298) *
                        1.9073486e-06 * fVar441;
              fVar364 = 1.0 - fVar440;
              fVar377 = fVar440 * 3.0;
              fVar450 = -fVar440 * fVar364 * fVar364 * 0.5;
              fVar387 = (fVar440 * fVar440 * (fVar377 + -5.0) + 2.0) * 0.5;
              fVar323 = ((fVar364 * 3.0 + -5.0) * fVar364 * fVar364 + 2.0) * 0.5;
              fVar325 = -fVar364 * fVar440 * fVar440 * 0.5;
              fVar376 = fVar450 * fStack_4bc +
                        fVar387 * fVar370 + fVar323 * fVar386 + fVar325 * fStack_56c;
              fVar300 = (fVar440 * (fVar364 + fVar364) - fVar364 * fVar364) * 0.5;
              fVar299 = ((fVar440 + fVar440) * (fVar377 + -5.0) + fVar440 * fVar377) * 0.5;
              fVar379 = ((fVar377 + 2.0) * (fVar364 + fVar364) + fVar364 * -3.0 * fVar364) * 0.5;
              fVar364 = (fVar364 * -2.0 * fVar440 + fVar440 * fVar440) * 0.5;
              fVar326 = fVar300 * (float)local_4c8._0_4_ +
                        fVar299 * fVar354 + fVar379 * fVar374 + fVar364 * (float)local_578._0_4_;
              fVar391 = fVar300 * (float)local_4c8._4_4_ +
                        fVar299 * fVar355 + fVar379 * fVar375 + fVar364 * fVar421;
              fVar328 = fVar300 * fStack_4c0 +
                        fVar299 * fVar363 + fVar379 * fVar378 + fVar364 * fStack_570;
              fVar329 = fVar300 * fStack_4bc +
                        fVar299 * fVar370 + fVar379 * fVar386 + fVar364 * fStack_56c;
              fVar379 = fVar440 * -3.0 + 2.0;
              fVar366 = fVar440 * 9.0 + -5.0;
              fVar364 = fVar440 * -9.0 + 4.0;
              fVar377 = fVar377 + -1.0;
              fVar299 = fVar379 * (float)local_4c8._0_4_ +
                        fVar366 * fVar354 + fVar364 * fVar374 + fVar377 * (float)local_578._0_4_;
              fVar300 = fVar379 * (float)local_4c8._4_4_ +
                        fVar366 * fVar355 + fVar364 * fVar375 + fVar377 * fVar421;
              fVar379 = fVar379 * fStack_4c0 +
                        fVar366 * fVar363 + fVar364 * fVar378 + fVar377 * fStack_570;
              fVar366 = (fVar441 * fVar298 + 0.0) -
                        (fVar450 * (float)local_4c8._0_4_ +
                        fVar387 * fVar354 + fVar323 * fVar374 + fVar325 * (float)local_578._0_4_);
              fVar322 = (fVar441 * fVar417 + 0.0) -
                        (fVar450 * (float)local_4c8._4_4_ +
                        fVar387 * fVar355 + fVar323 * fVar375 + fVar325 * fVar421);
              fVar323 = (fVar441 * fVar422 + 0.0) -
                        (fVar450 * fStack_4c0 +
                        fVar387 * fVar363 + fVar323 * fVar378 + fVar325 * fStack_570);
              fVar387 = (fVar441 * fVar439 + 0.0) - fVar376;
              fVar450 = fVar322 * fVar322;
              fVar364 = fVar323 * fVar323;
              fVar377 = fVar387 * fVar387;
              auVar384._0_4_ = fVar450 + fVar366 * fVar366 + fVar364;
              auVar384._4_4_ = fVar450 + fVar450 + fVar377;
              auVar384._8_4_ = fVar450 + fVar364 + fVar364;
              auVar384._12_4_ = fVar450 + fVar377 + fVar377;
              fVar450 = fVar444;
              if (fVar444 <= fVar453) {
                fVar450 = fVar453;
              }
              fVar364 = fVar391 * fVar391 + fVar326 * fVar326 + fVar328 * fVar328;
              auVar251 = ZEXT416((uint)fVar364);
              auVar339 = rsqrtss(ZEXT416((uint)fVar364),auVar251);
              fVar453 = auVar339._0_4_;
              fVar377 = fVar453 * 1.5 - fVar453 * fVar453 * fVar364 * 0.5 * fVar453;
              fVar454 = fVar326 * fVar377;
              fVar452 = fVar391 * fVar377;
              fVar455 = fVar328 * fVar377;
              fVar410 = fVar329 * fVar377;
              fVar445 = fVar379 * fVar328 + fVar300 * fVar391 + fVar299 * fVar326;
              auVar339 = rcpss(auVar251,auVar251);
              fVar453 = (2.0 - fVar364 * auVar339._0_4_) * auVar339._0_4_;
              fVar325 = fVar322 * fVar452;
              fVar368 = fVar323 * fVar455;
              fVar394 = fVar387 * fVar410;
              fVar451 = fVar325 + fVar366 * fVar454 + fVar368;
              fVar446 = fVar325 + fVar325 + fVar394;
              fVar368 = fVar325 + fVar368 + fVar368;
              fVar394 = fVar325 + fVar394 + fVar394;
              fVar428 = (SQRT(auVar384._0_4_) + 1.0) * (fVar444 / SQRT(fVar364)) +
                        SQRT(auVar384._0_4_) * fVar444 + fVar450;
              fVar325 = fVar410 * -fVar329;
              fVar377 = fVar455 * -fVar328 + fVar452 * -fVar391 + fVar454 * -fVar326 +
                        fVar453 * (fVar364 * fVar379 - fVar445 * fVar328) * fVar377 * fVar323 +
                        fVar453 * (fVar364 * fVar300 - fVar445 * fVar391) * fVar377 * fVar322 +
                        fVar453 * (fVar364 * fVar299 - fVar445 * fVar326) * fVar377 * fVar366;
              fVar379 = fVar422 * fVar455 + fVar417 * fVar452 + fVar298 * fVar454;
              fVar453 = auVar384._0_4_ - fVar451 * fVar451;
              auVar176._0_8_ = CONCAT44(auVar384._4_4_ - fVar446 * fVar446,fVar453);
              auVar176._8_4_ = auVar384._8_4_ - fVar368 * fVar368;
              auVar176._12_4_ = auVar384._12_4_ - fVar394 * fVar394;
              fVar299 = -fVar329 * fVar387;
              local_528 = CONCAT44(fVar325,fVar377);
              auVar228._8_4_ = auVar176._8_4_;
              auVar228._0_8_ = auVar176._0_8_;
              auVar228._12_4_ = auVar176._12_4_;
              auVar339 = rsqrtss(auVar228,auVar176);
              fVar364 = auVar339._0_4_;
              fVar364 = fVar364 * 1.5 - fVar364 * fVar364 * fVar453 * 0.5 * fVar364;
              if (fVar453 < 0.0) {
                fVar453 = sqrtf(fVar453);
                pRVar119 = extraout_RAX_00;
                pRVar124 = extraout_RDX_02;
              }
              else {
                fVar453 = SQRT(fVar453);
              }
              fVar453 = fVar453 - fVar376;
              fVar376 = ((-fVar328 * fVar323 + -fVar391 * fVar322 + -fVar326 * fVar366) -
                        fVar451 * fVar377) * fVar364 - fVar329;
              fVar364 = ((fVar422 * fVar323 + fVar417 * fVar322 + fVar298 * fVar366) -
                        fVar451 * fVar379) * fVar364;
              auVar432._0_8_ = CONCAT44(fVar299,fVar376) ^ 0x8000000080000000;
              auVar294._0_4_ = fVar377 * fVar364 - fVar379 * fVar376;
              auVar432._8_4_ = -fVar299;
              auVar432._12_4_ = fVar439 * fVar387;
              auVar431._8_8_ = auVar432._8_8_;
              auVar431._0_8_ = CONCAT44(fVar364,fVar376) ^ 0x80000000;
              auVar294._4_4_ = auVar294._0_4_;
              auVar294._8_4_ = auVar294._0_4_;
              auVar294._12_4_ = auVar294._0_4_;
              auVar251 = divps(auVar431,auVar294);
              auVar320._8_4_ = fVar325;
              auVar320._0_8_ = local_528;
              auVar320._12_4_ = -(fVar439 * fVar410);
              auVar319._8_8_ = auVar320._8_8_;
              auVar319._0_8_ = CONCAT44(fVar379,fVar377) ^ 0x8000000000000000;
              auVar339 = divps(auVar319,auVar294);
              fVar441 = fVar441 - (fVar453 * auVar339._0_4_ + fVar451 * auVar251._0_4_);
              fVar440 = fVar440 - (fVar453 * auVar339._4_4_ + fVar451 * auVar251._4_4_);
            } while ((fVar428 <= ABS(fVar451)) ||
                    (auVar342._12_4_ * 1.9073486e-06 + fVar450 + fVar428 <= ABS(fVar453)));
            fVar441 = local_328._0_4_ + fVar441;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar441) &&
               (((fVar298 = (ray->super_RayK<1>).tfar, fVar441 <= fVar298 && (0.0 <= fVar440)) &&
                (fVar440 <= 1.0)))) {
              auVar339 = rsqrtss(auVar384,auVar384);
              fVar417 = auVar339._0_4_;
              pGVar26 = (context->scene->geometries).items[uVar130].ptr;
              uVar134 = (ray->super_RayK<1>).mask;
              pRVar119 = (RTCRayN *)(ulong)uVar134;
              if ((pGVar26->mask & uVar134) != 0) {
                fVar417 = fVar417 * 1.5 + fVar417 * fVar417 * auVar384._0_4_ * -0.5 * fVar417;
                fVar366 = fVar366 * fVar417;
                fVar322 = fVar322 * fVar417;
                fVar323 = fVar323 * fVar417;
                fVar417 = fVar329 * fVar366 + fVar326;
                fVar422 = fVar329 * fVar322 + fVar391;
                fVar439 = fVar329 * fVar323 + fVar328;
                fVar450 = fVar322 * fVar326 - fVar391 * fVar366;
                fVar453 = fVar323 * fVar391 - fVar328 * fVar322;
                fVar376 = fVar366 * fVar328 - fVar326 * fVar323;
                fVar444 = fVar422 * fVar453 - fVar376 * fVar417;
                uVar189 = CONCAT44(fVar417 * fVar450 - fVar453 * fVar439,
                                   fVar439 * fVar376 - fVar450 * fVar422);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar441;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar189;
                  (ray->Ng).field_0.field_0.z = fVar444;
                  ray->u = fVar440;
                  ray->v = 0.0;
                  ray->primID = uVar132;
                  ray->geomID = uVar130;
                  ray->instID[0] = context->user->instID[0];
                  uVar134 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar134;
                  pRVar119 = (RTCRayN *)(ulong)uVar134;
                }
                else {
                  vu0.field_0._0_8_ = uVar189;
                  vu0.field_0.v[2] = fVar444;
                  vu0.field_0.v[3] = fVar440;
                  pRVar122 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  (ray->super_RayK<1>).tfar = fVar441;
                  local_4ec = -1;
                  args.geometryUserPtr = pGVar26->userPtr;
                  args.valid = &local_4ec;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_003b8bf4:
                    pRVar122 = context->args;
                    if ((pRVar122->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar122->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar122->filter)(&args);
                      pRVar124 = extraout_RDX_04;
                      if (*args.valid == 0) goto LAB_003b8ca0;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pRVar124 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar122 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar119 = args.ray;
                  }
                  else {
                    (*pGVar26->intersectionFilterN)(&args);
                    pRVar124 = extraout_RDX_03;
                    if (*args.valid != 0) goto LAB_003b8bf4;
LAB_003b8ca0:
                    (ray->super_RayK<1>).tfar = fVar298;
                    pRVar119 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_003b8ada:
            fVar298 = (ray->super_RayK<1>).tfar;
            auVar227._0_4_ = -(uint)(fVar327 <= fVar298) & local_368._0_4_;
            auVar227._4_4_ = -(uint)(fVar390 <= fVar298) & local_368._4_4_;
            auVar227._8_4_ = -(uint)(fVar397 <= fVar298) & local_368._8_4_;
            auVar227._12_4_ = -(uint)(fVar407 <= fVar298) & local_368._12_4_;
          }
          auVar321._4_4_ = -(uint)(fVar338 + fVar411 <= fVar298);
          auVar321._0_4_ = -(uint)(fVar338 + fVar405 <= fVar298);
          auVar321._8_4_ = -(uint)(fVar338 + fVar418 <= fVar298);
          auVar321._12_4_ = -(uint)(fVar338 + fVar425 <= fVar298);
          auVar321 = _local_4d8 & auVar312 & auVar321;
          auVar177._0_4_ =
               local_4e8._0_4_ & auVar292._0_4_ &
               -(uint)(fVar338 + tp1.lower.field_0.v[0] <= fVar298);
          auVar177._4_4_ =
               local_4e8._4_4_ & auVar292._4_4_ &
               -(uint)(fVar338 + tp1.lower.field_0.v[1] <= fVar298);
          auVar177._8_4_ =
               (uint)fStack_4e0 & auVar292._8_4_ &
               -(uint)(fVar338 + tp1.lower.field_0.v[2] <= fVar298);
          auVar177._12_4_ =
               (uint)fStack_4dc & auVar292._12_4_ &
               -(uint)(fVar338 + tp1.lower.field_0.v[3] <= fVar298);
          iVar263 = movmskps(0,auVar177 | auVar321);
          if (iVar263 != 0) {
            stack[(long)pRVar125].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar177 | auVar321);
            stack[(long)pRVar125].tlower.field_0.i[0] =
                 ~auVar321._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar405 & auVar321._0_4_;
            stack[(long)pRVar125].tlower.field_0.i[1] =
                 ~auVar321._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar411 & auVar321._4_4_;
            stack[(long)pRVar125].tlower.field_0.i[2] =
                 ~auVar321._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar418 & auVar321._8_4_;
            stack[(long)pRVar125].tlower.field_0.i[3] =
                 ~auVar321._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar425 & auVar321._12_4_;
            stack[(long)pRVar125].u0 = fVar231;
            stack[(long)pRVar125].u1 = fVar264;
            pRVar122 = (RTCIntersectArguments *)(ulong)((int)local_60c + 1U);
            stack[(long)pRVar125].depth = (int)local_60c + 1U;
            pRVar125 = (RTCIntersectArguments *)(ulong)((int)pRVar125 + 1);
          }
        }
      }
    }
    fVar231 = (ray->super_RayK<1>).tfar;
    pRVar123 = pRVar122;
    do {
      pRVar126 = pRVar125;
      iVar263 = (int)pRVar126;
      if (iVar263 == 0) {
        auVar179._4_4_ = -(uint)(fVar184 <= fVar231);
        auVar179._0_4_ = -(uint)(fVar140 <= fVar231);
        auVar179._8_4_ = -(uint)(fVar186 <= fVar231);
        auVar179._12_4_ = -(uint)(fVar187 <= fVar231);
        uVar130 = movmskps((int)pRVar123,auVar179);
        local_310 = (ulong)((uint)local_310 - 1 & (uint)local_310 & uVar130);
        goto LAB_003b65b9;
      }
      pRVar123 = (RTCIntersectArguments *)(ulong)(iVar263 - 1U);
      fVar264 = stack[(long)pRVar123].tlower.field_0.v[0];
      fVar298 = stack[(long)pRVar123].tlower.field_0.v[1];
      fVar327 = stack[(long)pRVar123].tlower.field_0.v[2];
      fVar390 = stack[(long)pRVar123].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(fVar338 + fVar264 <= fVar231) & stack[(long)pRVar123].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fVar338 + fVar298 <= fVar231) & stack[(long)pRVar123].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fVar338 + fVar327 <= fVar231) & stack[(long)pRVar123].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fVar338 + fVar390 <= fVar231) & stack[(long)pRVar123].valid.field_0.i[3];
      uVar134 = movmskps((int)pRVar124,(undefined1  [16])args._0_16_);
      pRVar124 = (RTCIntersectArguments *)(ulong)uVar134;
      pRVar125 = pRVar123;
    } while (uVar134 == 0);
    auVar260._0_4_ = (uint)fVar264 & (uint)args.valid;
    auVar260._4_4_ = (uint)fVar298 & args.valid._4_4_;
    auVar260._8_4_ = (uint)fVar327 & (uint)args.geometryUserPtr;
    auVar260._12_4_ = (uint)fVar390 & args.geometryUserPtr._4_4_;
    auVar295._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar295._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar295._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar295 = auVar295 | auVar260;
    auVar261._4_4_ = auVar295._0_4_;
    auVar261._0_4_ = auVar295._4_4_;
    auVar261._8_4_ = auVar295._12_4_;
    auVar261._12_4_ = auVar295._8_4_;
    auVar339 = minps(auVar261,auVar295);
    auVar229._0_8_ = auVar339._8_8_;
    auVar229._8_4_ = auVar339._0_4_;
    auVar229._12_4_ = auVar339._4_4_;
    auVar339 = minps(auVar229,auVar339);
    auVar230._0_8_ =
         CONCAT44(-(uint)(auVar339._4_4_ == auVar295._4_4_) & args.valid._4_4_,
                  -(uint)(auVar339._0_4_ == auVar295._0_4_) & (uint)args.valid);
    auVar230._8_4_ = -(uint)(auVar339._8_4_ == auVar295._8_4_) & (uint)args.geometryUserPtr;
    auVar230._12_4_ = -(uint)(auVar339._12_4_ == auVar295._12_4_) & args.geometryUserPtr._4_4_;
    iVar183 = movmskps(iVar263 - 1U,auVar230);
    auVar178 = (undefined1  [16])args._0_16_;
    if (iVar183 != 0) {
      auVar178._8_4_ = auVar230._8_4_;
      auVar178._0_8_ = auVar230._0_8_;
      auVar178._12_4_ = auVar230._12_4_;
    }
    pSVar118 = stack + (long)pRVar123;
    uVar134 = movmskps(iVar183,auVar178);
    pRVar122 = (RTCIntersectArguments *)0x0;
    if (uVar134 != 0) {
      for (; (uVar134 >> (long)pRVar122 & 1) == 0;
          pRVar122 = (RTCIntersectArguments *)((long)&pRVar122->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&args.valid + (long)pRVar122 * 4) = 0;
    uVar9 = stack[(long)pRVar123].u0;
    uVar18 = stack[(long)pRVar123].u1;
    local_60c = (float)stack[(long)pRVar123].depth;
    iVar183 = movmskps(local_60c,(undefined1  [16])args._0_16_);
    pRVar124 = (RTCIntersectArguments *)(ulong)(iVar263 - 1);
    if (iVar183 != 0) {
      pRVar124 = pRVar126;
    }
    (pSVar118->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar231 = (float)uVar18 - (float)uVar9;
    vu0.field_0.v[1] = fVar231 * 0.33333334 + (float)uVar9;
    vu0.field_0.v[0] = fVar231 * 0.0 + (float)uVar9;
    vu0.field_0.v[2] = fVar231 * 0.6666667 + (float)uVar9;
    vu0.field_0.v[3] = fVar231 * 1.0 + (float)uVar9;
    fVar231 = vu0.field_0.v[(long)pRVar122];
    fVar264 = *(float *)((long)&vu0.field_0 + (long)pRVar122 * 4 + 4);
    pRVar125 = pRVar124;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }